

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx2::forward
          (Convolution1D_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  _func_int *p_Var4;
  size_t sVar5;
  void *pvVar6;
  _func_int **pp_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  ulong uVar35;
  uint *puVar36;
  int j;
  int iVar37;
  undefined1 (*pauVar38) [32];
  ulong uVar39;
  undefined4 *puVar40;
  float *pfVar41;
  int iVar42;
  uint *puVar43;
  int iVar44;
  int j_5;
  ulong uVar45;
  int j_2;
  long lVar46;
  int j_1;
  int _elempack;
  bool bVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar138 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar264;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar265;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 local_158 [32];
  int local_118;
  Mat bottom_blob_bordered;
  Mat local_80;
  ulong local_38;
  
  uVar45 = bottom_blob->elemsize;
  iVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
  iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar44 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx2 + (long)p_Var4),bottom_blob
             ,&bottom_blob_bordered,opt);
  iVar28 = bottom_blob_bordered.h;
  local_118 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    uVar3 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]);
    if (opt->use_packing_layout == true) {
      lVar30 = 8;
      if ((uVar3 & 7) != 0) {
        lVar30 = (ulong)((uVar3 & 3) == 0) * 3 + 1;
      }
    }
    else {
      lVar30 = 1;
    }
    _elempack = (int)lVar30;
    iVar31 = (bottom_blob_bordered.w + ~((iVar31 + -1) * iVar44)) /
             *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx2[-3]);
    uVar29 = (long)(int)uVar3 / (long)_elempack & 0xffffffff;
    iVar44 = (int)((long)(int)uVar3 / (long)_elempack);
    Mat::create(top_blob,iVar31 + 1,iVar44,lVar30 * (uVar45 / (ulong)(long)iVar2),_elempack,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((iVar2 == 8) && (_elempack == 8)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        uVar35 = 0;
        if (0 < iVar44) {
          uVar35 = uVar29;
        }
        for (uVar34 = 0; uVar34 != uVar35; uVar34 = uVar34 + 1) {
          pauVar32 = (undefined1 (*) [32])
                     ((long)top_blob->w * uVar34 * top_blob->elemsize + (long)top_blob->data);
          for (iVar37 = 0; iVar37 <= iVar31; iVar37 = iVar37 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              local_158 = ZEXT1632(ZEXT816(0) << 0x40);
            }
            else {
              local_158 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0x190 +
                                     (long)this->_vptr_Convolution1D_x86_avx2[-3]) + uVar34 * 0x20);
            }
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar34);
            pauVar38 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            for (uVar39 = 0; uVar39 != uVar45; uVar39 = uVar39 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              puVar40 = (undefined4 *)
                        ((long)bottom_blob_bordered.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar37 * 8) * 4 +
                        (long)bottom_blob_bordered.w *
                        CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                 (undefined4)bottom_blob_bordered.elemsize) * uVar39);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar42 = 0;
              }
              while (bVar47 = iVar42 != 0, iVar42 = iVar42 + -1, bVar47) {
                uVar1 = *puVar40;
                auVar171._4_4_ = uVar1;
                auVar171._0_4_ = uVar1;
                auVar171._8_4_ = uVar1;
                auVar171._12_4_ = uVar1;
                auVar171._16_4_ = uVar1;
                auVar171._20_4_ = uVar1;
                auVar171._24_4_ = uVar1;
                auVar171._28_4_ = uVar1;
                uVar1 = puVar40[1];
                auVar292._4_4_ = uVar1;
                auVar292._0_4_ = uVar1;
                auVar292._8_4_ = uVar1;
                auVar292._12_4_ = uVar1;
                auVar292._16_4_ = uVar1;
                auVar292._20_4_ = uVar1;
                auVar292._24_4_ = uVar1;
                auVar292._28_4_ = uVar1;
                uVar1 = puVar40[2];
                auVar244._4_4_ = uVar1;
                auVar244._0_4_ = uVar1;
                auVar244._8_4_ = uVar1;
                auVar244._12_4_ = uVar1;
                auVar244._16_4_ = uVar1;
                auVar244._20_4_ = uVar1;
                auVar244._24_4_ = uVar1;
                auVar244._28_4_ = uVar1;
                uVar1 = puVar40[3];
                auVar291._4_4_ = uVar1;
                auVar291._0_4_ = uVar1;
                auVar291._8_4_ = uVar1;
                auVar291._12_4_ = uVar1;
                auVar291._16_4_ = uVar1;
                auVar291._20_4_ = uVar1;
                auVar291._24_4_ = uVar1;
                auVar291._28_4_ = uVar1;
                uVar1 = puVar40[4];
                auVar317._4_4_ = uVar1;
                auVar317._0_4_ = uVar1;
                auVar317._8_4_ = uVar1;
                auVar317._12_4_ = uVar1;
                auVar317._16_4_ = uVar1;
                auVar317._20_4_ = uVar1;
                auVar317._24_4_ = uVar1;
                auVar317._28_4_ = uVar1;
                uVar1 = puVar40[5];
                auVar367._4_4_ = uVar1;
                auVar367._0_4_ = uVar1;
                auVar367._8_4_ = uVar1;
                auVar367._12_4_ = uVar1;
                auVar367._16_4_ = uVar1;
                auVar367._20_4_ = uVar1;
                auVar367._24_4_ = uVar1;
                auVar367._28_4_ = uVar1;
                uVar1 = puVar40[6];
                auVar387._4_4_ = uVar1;
                auVar387._0_4_ = uVar1;
                auVar387._8_4_ = uVar1;
                auVar387._12_4_ = uVar1;
                auVar387._16_4_ = uVar1;
                auVar387._20_4_ = uVar1;
                auVar387._24_4_ = uVar1;
                auVar387._28_4_ = uVar1;
                uVar1 = puVar40[7];
                auVar413._4_4_ = uVar1;
                auVar413._0_4_ = uVar1;
                auVar413._8_4_ = uVar1;
                auVar413._12_4_ = uVar1;
                auVar413._16_4_ = uVar1;
                auVar413._20_4_ = uVar1;
                auVar413._24_4_ = uVar1;
                auVar413._28_4_ = uVar1;
                auVar210 = vfmadd132ps_fma(auVar171,local_158,*pauVar38);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar292,pauVar38[1]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar244,pauVar38[2]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar291,pauVar38[3]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar317,pauVar38[4]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar367,pauVar38[5]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar387,pauVar38[6]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar413,pauVar38[7]);
                puVar40 = puVar40 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 8;
                pauVar38 = pauVar38 + 8;
                local_158 = ZEXT1632(auVar210);
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar95 = local_158;
            if (*(int *)(&this->field_0xf4 + (long)p_Var4) - 1U < 6) {
              auVar210 = ZEXT816(0) << 0x40;
              auVar95 = vmaxps_avx(local_158,ZEXT1632(auVar210));
              fVar49 = local_158._8_4_;
              fVar48 = local_158._12_4_;
              fVar11 = local_158._16_4_;
              fVar265 = local_158._20_4_;
              fVar264 = local_158._24_4_;
              switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
              case 2:
                auVar171 = vminps_avx(local_158,ZEXT1632(auVar210));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar245._4_4_ = uVar1;
                auVar245._0_4_ = uVar1;
                auVar245._8_4_ = uVar1;
                auVar245._12_4_ = uVar1;
                auVar245._16_4_ = uVar1;
                auVar245._20_4_ = uVar1;
                auVar245._24_4_ = uVar1;
                auVar245._28_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(auVar95,auVar171,auVar245);
                auVar95 = ZEXT1632(auVar210);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar96._4_4_ = uVar1;
                auVar96._0_4_ = uVar1;
                auVar96._8_4_ = uVar1;
                auVar96._12_4_ = uVar1;
                auVar96._16_4_ = uVar1;
                auVar96._20_4_ = uVar1;
                auVar96._24_4_ = uVar1;
                auVar96._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar173._4_4_ = uVar1;
                auVar173._0_4_ = uVar1;
                auVar173._8_4_ = uVar1;
                auVar173._12_4_ = uVar1;
                auVar173._16_4_ = uVar1;
                auVar173._20_4_ = uVar1;
                auVar173._24_4_ = uVar1;
                auVar173._28_4_ = uVar1;
                auVar171 = vmaxps_avx(local_158,auVar96);
                auVar95 = vminps_avx(auVar171,auVar173);
                break;
              case 4:
                auVar97._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
                auVar97._8_4_ = -fVar49;
                auVar97._12_4_ = -fVar48;
                auVar97._16_4_ = -fVar11;
                auVar97._20_4_ = -fVar265;
                auVar97._24_4_ = -fVar264;
                auVar97._28_4_ = local_158._28_4_ ^ 0x80000000;
                auVar174._8_4_ = 0x42b0c0a5;
                auVar174._0_8_ = 0x42b0c0a542b0c0a5;
                auVar174._12_4_ = 0x42b0c0a5;
                auVar174._16_4_ = 0x42b0c0a5;
                auVar174._20_4_ = 0x42b0c0a5;
                auVar174._24_4_ = 0x42b0c0a5;
                auVar174._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar97,auVar174);
                auVar175._8_4_ = 0xc2b0c0a5;
                auVar175._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar175._12_4_ = 0xc2b0c0a5;
                auVar175._16_4_ = 0xc2b0c0a5;
                auVar175._20_4_ = 0xc2b0c0a5;
                auVar175._24_4_ = 0xc2b0c0a5;
                auVar175._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar175);
                auVar176._8_4_ = 0x3fb8aa3b;
                auVar176._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar176._12_4_ = 0x3fb8aa3b;
                auVar176._16_4_ = 0x3fb8aa3b;
                auVar176._20_4_ = 0x3fb8aa3b;
                auVar176._24_4_ = 0x3fb8aa3b;
                auVar176._28_4_ = 0x3fb8aa3b;
                auVar323._8_4_ = 0x3f000000;
                auVar323._0_8_ = 0x3f0000003f000000;
                auVar323._12_4_ = 0x3f000000;
                auVar323._16_4_ = 0x3f000000;
                auVar323._20_4_ = 0x3f000000;
                auVar323._24_4_ = 0x3f000000;
                auVar323._28_4_ = 0x3f000000;
                auVar210 = vfmadd213ps_fma(auVar176,auVar292,auVar323);
                auVar244 = vroundps_avx(ZEXT1632(auVar210),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar210),auVar244,1);
                auVar369._8_4_ = 0x3f800000;
                auVar369._0_8_ = 0x3f8000003f800000;
                auVar369._12_4_ = 0x3f800000;
                auVar369._16_4_ = 0x3f800000;
                auVar369._20_4_ = 0x3f800000;
                auVar369._24_4_ = 0x3f800000;
                auVar369._28_4_ = 0x3f800000;
                auVar171 = vandps_avx(auVar171,auVar369);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar250._8_4_ = 0xbf317218;
                auVar250._0_8_ = 0xbf317218bf317218;
                auVar250._12_4_ = 0xbf317218;
                auVar250._16_4_ = 0xbf317218;
                auVar250._20_4_ = 0xbf317218;
                auVar250._24_4_ = 0xbf317218;
                auVar250._28_4_ = 0xbf317218;
                auVar141 = vfmadd231ps_fma(auVar292,auVar171,auVar250);
                auVar292 = ZEXT1632(auVar141);
                fVar49 = auVar141._0_4_;
                fVar48 = auVar141._4_4_;
                fVar11 = auVar141._8_4_;
                fVar265 = auVar141._12_4_;
                auVar17._28_4_ = 0xbf317218;
                auVar17._0_28_ =
                     ZEXT1628(CONCAT412(fVar265 * fVar265,
                                        CONCAT48(fVar11 * fVar11,
                                                 CONCAT44(fVar48 * fVar48,fVar49 * fVar49))));
                auVar293._8_4_ = 0x39506967;
                auVar293._0_8_ = 0x3950696739506967;
                auVar293._12_4_ = 0x39506967;
                auVar293._16_4_ = 0x39506967;
                auVar293._20_4_ = 0x39506967;
                auVar293._24_4_ = 0x39506967;
                auVar293._28_4_ = 0x39506967;
                auVar390._8_4_ = 0x3ab743ce;
                auVar390._0_8_ = 0x3ab743ce3ab743ce;
                auVar390._12_4_ = 0x3ab743ce;
                auVar390._16_4_ = 0x3ab743ce;
                auVar390._20_4_ = 0x3ab743ce;
                auVar390._24_4_ = 0x3ab743ce;
                auVar390._28_4_ = 0x3ab743ce;
                auVar210 = vfmadd213ps_fma(auVar293,auVar292,auVar390);
                auVar391._8_4_ = 0x3c088908;
                auVar391._0_8_ = 0x3c0889083c088908;
                auVar391._12_4_ = 0x3c088908;
                auVar391._16_4_ = 0x3c088908;
                auVar391._20_4_ = 0x3c088908;
                auVar391._24_4_ = 0x3c088908;
                auVar391._28_4_ = 0x3c088908;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar391);
                auVar392._8_4_ = 0x3d2aa9c1;
                auVar392._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar392._12_4_ = 0x3d2aa9c1;
                auVar392._16_4_ = 0x3d2aa9c1;
                auVar392._20_4_ = 0x3d2aa9c1;
                auVar392._24_4_ = 0x3d2aa9c1;
                auVar392._28_4_ = 0x3d2aa9c1;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar392);
                auVar393._8_4_ = 0x3e2aaaaa;
                auVar393._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar393._12_4_ = 0x3e2aaaaa;
                auVar393._16_4_ = 0x3e2aaaaa;
                auVar393._20_4_ = 0x3e2aaaaa;
                auVar393._24_4_ = 0x3e2aaaaa;
                auVar393._28_4_ = 0x3e2aaaaa;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar393);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar323);
                auVar324._0_4_ = fVar49 + 1.0;
                auVar324._4_4_ = fVar48 + 1.0;
                auVar324._8_4_ = fVar11 + 1.0;
                auVar324._12_4_ = fVar265 + 1.0;
                auVar324._16_4_ = 0x3f800000;
                auVar324._20_4_ = 0x3f800000;
                auVar324._24_4_ = 0x3f800000;
                auVar324._28_4_ = 0x3f800000;
                auVar210 = vfmadd231ps_fma(auVar324,auVar17,ZEXT1632(auVar210));
                auVar98._0_4_ = (int)auVar171._0_4_;
                auVar98._4_4_ = (int)auVar171._4_4_;
                auVar98._8_4_ = (int)auVar171._8_4_;
                auVar98._12_4_ = (int)auVar171._12_4_;
                auVar98._16_4_ = (int)auVar171._16_4_;
                auVar98._20_4_ = (int)auVar171._20_4_;
                auVar98._24_4_ = (int)auVar171._24_4_;
                auVar98._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar98,0x17);
                auVar177._8_4_ = 0x3f800000;
                auVar177._0_8_ = 0x3f8000003f800000;
                auVar177._12_4_ = 0x3f800000;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar171 = vpaddd_avx2(auVar171,auVar177);
                auVar210 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar210),auVar369);
                auVar171 = vrcpps_avx(ZEXT1632(auVar210));
                auVar210 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar171,auVar369);
                auVar210 = vfnmadd132ps_fma(ZEXT1632(auVar210),auVar171,auVar171);
                auVar95 = ZEXT1632(auVar210);
                break;
              case 5:
                auVar388._8_4_ = 0x42b0c0a5;
                auVar388._0_8_ = 0x42b0c0a542b0c0a5;
                auVar388._12_4_ = 0x42b0c0a5;
                auVar388._16_4_ = 0x42b0c0a5;
                auVar388._20_4_ = 0x42b0c0a5;
                auVar388._24_4_ = 0x42b0c0a5;
                auVar388._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(local_158,auVar388);
                auVar414._8_4_ = 0xc2b0c0a5;
                auVar414._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar414._12_4_ = 0xc2b0c0a5;
                auVar414._16_4_ = 0xc2b0c0a5;
                auVar414._20_4_ = 0xc2b0c0a5;
                auVar414._24_4_ = 0xc2b0c0a5;
                auVar414._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar414);
                auVar170._8_4_ = 0x3fb8aa3b;
                auVar170._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar170._12_4_ = 0x3fb8aa3b;
                auVar170._16_4_ = 0x3fb8aa3b;
                auVar170._20_4_ = 0x3fb8aa3b;
                auVar170._24_4_ = 0x3fb8aa3b;
                auVar170._28_4_ = 0x3fb8aa3b;
                auVar429._8_4_ = 0x3f000000;
                auVar429._0_8_ = 0x3f0000003f000000;
                auVar429._12_4_ = 0x3f000000;
                auVar429._16_4_ = 0x3f000000;
                auVar429._20_4_ = 0x3f000000;
                auVar429._24_4_ = 0x3f000000;
                auVar429._28_4_ = 0x3f000000;
                auVar141 = vfmadd213ps_fma(auVar170,auVar292,auVar429);
                auVar244 = vroundps_avx(ZEXT1632(auVar141),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar141),auVar244,1);
                auVar435._8_4_ = 0x3f800000;
                auVar435._0_8_ = 0x3f8000003f800000;
                auVar435._12_4_ = 0x3f800000;
                auVar435._16_4_ = 0x3f800000;
                auVar435._20_4_ = 0x3f800000;
                auVar435._24_4_ = 0x3f800000;
                auVar435._28_4_ = 0x3f800000;
                auVar171 = vandps_avx(auVar435,auVar171);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar415._8_4_ = 0x3f317218;
                auVar415._0_8_ = 0x3f3172183f317218;
                auVar415._12_4_ = 0x3f317218;
                auVar415._16_4_ = 0x3f317218;
                auVar415._20_4_ = 0x3f317218;
                auVar415._24_4_ = 0x3f317218;
                auVar415._28_4_ = 0x3f317218;
                auVar300 = vfnmadd231ps_fma(auVar292,auVar171,auVar415);
                auVar292 = ZEXT1632(auVar300);
                fVar8 = auVar300._0_4_;
                fVar9 = auVar300._4_4_;
                fVar10 = auVar300._8_4_;
                fVar12 = auVar300._12_4_;
                auVar13._28_4_ = auVar244._28_4_;
                auVar13._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar10 * fVar10,
                                                 CONCAT44(fVar9 * fVar9,fVar8 * fVar8))));
                auVar441._8_4_ = 0x39506967;
                auVar441._0_8_ = 0x3950696739506967;
                auVar441._12_4_ = 0x39506967;
                auVar441._16_4_ = 0x39506967;
                auVar441._20_4_ = 0x39506967;
                auVar441._24_4_ = 0x39506967;
                auVar441._28_4_ = 0x39506967;
                auVar447._8_4_ = 0x3ab743ce;
                auVar447._0_8_ = 0x3ab743ce3ab743ce;
                auVar447._12_4_ = 0x3ab743ce;
                auVar447._16_4_ = 0x3ab743ce;
                auVar447._20_4_ = 0x3ab743ce;
                auVar447._24_4_ = 0x3ab743ce;
                auVar447._28_4_ = 0x3ab743ce;
                auVar141 = vfmadd213ps_fma(auVar441,auVar292,auVar447);
                auVar453._8_4_ = 0x3c088908;
                auVar453._0_8_ = 0x3c0889083c088908;
                auVar453._12_4_ = 0x3c088908;
                auVar453._16_4_ = 0x3c088908;
                auVar453._20_4_ = 0x3c088908;
                auVar453._24_4_ = 0x3c088908;
                auVar453._28_4_ = 0x3c088908;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),auVar292,auVar453);
                auVar459._8_4_ = 0x3d2aa9c1;
                auVar459._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar459._12_4_ = 0x3d2aa9c1;
                auVar459._16_4_ = 0x3d2aa9c1;
                auVar459._20_4_ = 0x3d2aa9c1;
                auVar459._24_4_ = 0x3d2aa9c1;
                auVar459._28_4_ = 0x3d2aa9c1;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),auVar292,auVar459);
                auVar465._8_4_ = 0x3e2aaaaa;
                auVar465._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar465._12_4_ = 0x3e2aaaaa;
                auVar465._16_4_ = 0x3e2aaaaa;
                auVar465._20_4_ = 0x3e2aaaaa;
                auVar465._24_4_ = 0x3e2aaaaa;
                auVar465._28_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar300),auVar465);
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar300),auVar429);
                auVar318._0_4_ = fVar8 + 1.0;
                auVar318._4_4_ = fVar9 + 1.0;
                auVar318._8_4_ = fVar10 + 1.0;
                auVar318._12_4_ = fVar12 + 1.0;
                auVar318._16_4_ = 0x3f800000;
                auVar318._20_4_ = 0x3f800000;
                auVar318._24_4_ = 0x3f800000;
                auVar318._28_4_ = 0x3f800000;
                auVar141 = vfmadd231ps_fma(auVar318,auVar13,ZEXT1632(auVar141));
                auVar82._0_4_ = (int)auVar171._0_4_;
                auVar82._4_4_ = (int)auVar171._4_4_;
                auVar82._8_4_ = (int)auVar171._8_4_;
                auVar82._12_4_ = (int)auVar171._12_4_;
                auVar82._16_4_ = (int)auVar171._16_4_;
                auVar82._20_4_ = (int)auVar171._20_4_;
                auVar82._24_4_ = (int)auVar171._24_4_;
                auVar82._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar82,0x17);
                auVar389._8_4_ = 0x3f800000;
                auVar389._0_8_ = 0x3f8000003f800000;
                auVar389._12_4_ = 0x3f800000;
                auVar389._16_4_ = 0x3f800000;
                auVar389._20_4_ = 0x3f800000;
                auVar389._24_4_ = 0x3f800000;
                auVar389._28_4_ = 0x3f800000;
                auVar171 = vpaddd_avx2(auVar171,auVar389);
                auVar141 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar141),auVar435);
                auVar246._8_4_ = 0x800000;
                auVar246._0_8_ = 0x80000000800000;
                auVar246._12_4_ = 0x800000;
                auVar246._16_4_ = 0x800000;
                auVar246._20_4_ = 0x800000;
                auVar246._24_4_ = 0x800000;
                auVar246._28_4_ = 0x800000;
                auVar171 = vmaxps_avx(ZEXT1632(auVar141),auVar246);
                auVar292 = vpsrld_avx2(auVar171,0x17);
                auVar319._8_4_ = 0x807fffff;
                auVar319._0_8_ = 0x807fffff807fffff;
                auVar319._12_4_ = 0x807fffff;
                auVar319._16_4_ = 0x807fffff;
                auVar319._20_4_ = 0x807fffff;
                auVar319._24_4_ = 0x807fffff;
                auVar319._28_4_ = 0x807fffff;
                auVar171 = vandps_avx(auVar171,auVar319);
                auVar320._8_4_ = 0x3f000000;
                auVar320._0_8_ = 0x3f0000003f000000;
                auVar320._12_4_ = 0x3f000000;
                auVar320._16_4_ = 0x3f000000;
                auVar320._20_4_ = 0x3f000000;
                auVar320._24_4_ = 0x3f000000;
                auVar320._28_4_ = 0x3f000000;
                auVar244 = vorps_avx(auVar171,auVar320);
                auVar321._8_4_ = 0xffffff82;
                auVar321._0_8_ = 0xffffff82ffffff82;
                auVar321._12_4_ = 0xffffff82;
                auVar321._16_4_ = 0xffffff82;
                auVar321._20_4_ = 0xffffff82;
                auVar321._24_4_ = 0xffffff82;
                auVar321._28_4_ = 0xffffff82;
                auVar291 = vpaddd_avx2(auVar292,auVar321);
                auVar83._8_4_ = 0x3f3504f3;
                auVar83._0_8_ = 0x3f3504f33f3504f3;
                auVar83._12_4_ = 0x3f3504f3;
                auVar83._16_4_ = 0x3f3504f3;
                auVar83._20_4_ = 0x3f3504f3;
                auVar83._24_4_ = 0x3f3504f3;
                auVar83._28_4_ = 0x3f3504f3;
                auVar292 = vcmpps_avx(auVar244,auVar83,1);
                auVar171 = vandps_avx(auVar292,auVar244);
                auVar423._8_4_ = 0xbf800000;
                auVar423._0_8_ = 0xbf800000bf800000;
                auVar423._12_4_ = 0xbf800000;
                auVar423._16_4_ = 0xbf800000;
                auVar423._20_4_ = 0xbf800000;
                auVar423._24_4_ = 0xbf800000;
                auVar423._28_4_ = 0xbf800000;
                auVar247._0_4_ = auVar244._0_4_ + -1.0 + auVar171._0_4_;
                auVar247._4_4_ = auVar244._4_4_ + -1.0 + auVar171._4_4_;
                auVar247._8_4_ = auVar244._8_4_ + -1.0 + auVar171._8_4_;
                auVar247._12_4_ = auVar244._12_4_ + -1.0 + auVar171._12_4_;
                auVar247._16_4_ = auVar244._16_4_ + -1.0 + auVar171._16_4_;
                auVar247._20_4_ = auVar244._20_4_ + -1.0 + auVar171._20_4_;
                auVar247._24_4_ = auVar244._24_4_ + -1.0 + auVar171._24_4_;
                auVar247._28_4_ = auVar244._28_4_ + -1.0 + auVar171._28_4_;
                auVar244 = vcmpps_avx(ZEXT1632(auVar141),ZEXT1632(auVar210),2);
                auVar291 = vcvtdq2ps_avx(auVar291);
                auVar171 = vandps_avx(auVar435,auVar292);
                auVar171 = vsubps_avx(auVar291,auVar171);
                auVar322._8_4_ = 0x3d9021bb;
                auVar322._0_8_ = 0x3d9021bb3d9021bb;
                auVar322._12_4_ = 0x3d9021bb;
                auVar322._16_4_ = 0x3d9021bb;
                auVar322._20_4_ = 0x3d9021bb;
                auVar322._24_4_ = 0x3d9021bb;
                auVar322._28_4_ = 0x3d9021bb;
                auVar84._8_4_ = 0xbdebd1b8;
                auVar84._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar84._12_4_ = 0xbdebd1b8;
                auVar84._16_4_ = 0xbdebd1b8;
                auVar84._20_4_ = 0xbdebd1b8;
                auVar84._24_4_ = 0xbdebd1b8;
                auVar84._28_4_ = 0xbdebd1b8;
                auVar210 = vfmadd213ps_fma(auVar322,auVar247,auVar84);
                auVar85._8_4_ = 0x3def251a;
                auVar85._0_8_ = 0x3def251a3def251a;
                auVar85._12_4_ = 0x3def251a;
                auVar85._16_4_ = 0x3def251a;
                auVar85._20_4_ = 0x3def251a;
                auVar85._24_4_ = 0x3def251a;
                auVar85._28_4_ = 0x3def251a;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar247,auVar85);
                auVar86._8_4_ = 0xbdfe5d4f;
                auVar86._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar86._12_4_ = 0xbdfe5d4f;
                auVar86._16_4_ = 0xbdfe5d4f;
                auVar86._20_4_ = 0xbdfe5d4f;
                auVar86._24_4_ = 0xbdfe5d4f;
                auVar86._28_4_ = 0xbdfe5d4f;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar247,auVar86);
                auVar87._8_4_ = 0x3e11e9bf;
                auVar87._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar87._12_4_ = 0x3e11e9bf;
                auVar87._16_4_ = 0x3e11e9bf;
                auVar87._20_4_ = 0x3e11e9bf;
                auVar87._24_4_ = 0x3e11e9bf;
                auVar87._28_4_ = 0x3e11e9bf;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar247,auVar87);
                auVar88._8_4_ = 0xbe2aae50;
                auVar88._0_8_ = 0xbe2aae50be2aae50;
                auVar88._12_4_ = 0xbe2aae50;
                auVar88._16_4_ = 0xbe2aae50;
                auVar88._20_4_ = 0xbe2aae50;
                auVar88._24_4_ = 0xbe2aae50;
                auVar88._28_4_ = 0xbe2aae50;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar247,auVar88);
                auVar89._8_4_ = 0x3e4cceac;
                auVar89._0_8_ = 0x3e4cceac3e4cceac;
                auVar89._12_4_ = 0x3e4cceac;
                auVar89._16_4_ = 0x3e4cceac;
                auVar89._20_4_ = 0x3e4cceac;
                auVar89._24_4_ = 0x3e4cceac;
                auVar89._28_4_ = 0x3e4cceac;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar247,auVar89);
                auVar90._8_4_ = 0xbe7ffffc;
                auVar90._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar90._12_4_ = 0xbe7ffffc;
                auVar90._16_4_ = 0xbe7ffffc;
                auVar90._20_4_ = 0xbe7ffffc;
                auVar90._24_4_ = 0xbe7ffffc;
                auVar90._28_4_ = 0xbe7ffffc;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar247,auVar90);
                auVar91._8_4_ = 0x3eaaaaaa;
                auVar91._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar91._12_4_ = 0x3eaaaaaa;
                auVar91._16_4_ = 0x3eaaaaaa;
                auVar91._20_4_ = 0x3eaaaaaa;
                auVar91._24_4_ = 0x3eaaaaaa;
                auVar91._28_4_ = 0x3eaaaaaa;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar247,auVar91);
                auVar141 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar247,auVar429);
                auVar210 = vfmadd213ps_fma(auVar171,auVar415,auVar247);
                auVar14._4_4_ = auVar247._4_4_ * auVar247._4_4_;
                auVar14._0_4_ = auVar247._0_4_ * auVar247._0_4_;
                auVar14._8_4_ = auVar247._8_4_ * auVar247._8_4_;
                auVar14._12_4_ = auVar247._12_4_ * auVar247._12_4_;
                auVar14._16_4_ = auVar247._16_4_ * auVar247._16_4_;
                auVar14._20_4_ = auVar247._20_4_ * auVar247._20_4_;
                auVar14._24_4_ = auVar247._24_4_ * auVar247._24_4_;
                auVar14._28_4_ = auVar247._28_4_;
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar14,ZEXT1632(auVar141));
                auVar368._8_4_ = 0xc0000000;
                auVar368._0_8_ = 0xc0000000c0000000;
                auVar368._12_4_ = 0xc0000000;
                auVar368._16_4_ = 0xc0000000;
                auVar368._20_4_ = 0xc0000000;
                auVar368._24_4_ = 0xc0000000;
                auVar368._28_4_ = 0xc0000000;
                auVar15._4_4_ = auVar210._4_4_ * -2.0;
                auVar15._0_4_ = auVar210._0_4_ * -2.0;
                auVar15._8_4_ = auVar210._8_4_ * -2.0;
                auVar15._12_4_ = auVar210._12_4_ * -2.0;
                auVar15._16_4_ = 0x80000000;
                auVar15._20_4_ = 0x80000000;
                auVar15._24_4_ = 0x80000000;
                auVar15._28_4_ = auVar247._28_4_;
                auVar92._8_4_ = 0x7fffffff;
                auVar92._0_8_ = 0x7fffffff7fffffff;
                auVar92._12_4_ = 0x7fffffff;
                auVar92._16_4_ = 0x7fffffff;
                auVar92._20_4_ = 0x7fffffff;
                auVar92._24_4_ = 0x7fffffff;
                auVar92._28_4_ = 0x7fffffff;
                auVar171 = vblendvps_avx(auVar15,auVar92,auVar244);
                auVar93._8_4_ = 0x42b0c0a5;
                auVar93._0_8_ = 0x42b0c0a542b0c0a5;
                auVar93._12_4_ = 0x42b0c0a5;
                auVar93._16_4_ = 0x42b0c0a5;
                auVar93._20_4_ = 0x42b0c0a5;
                auVar93._24_4_ = 0x42b0c0a5;
                auVar93._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar93);
                auVar94._8_4_ = 0xc2b0c0a5;
                auVar94._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar94._12_4_ = 0xc2b0c0a5;
                auVar94._16_4_ = 0xc2b0c0a5;
                auVar94._20_4_ = 0xc2b0c0a5;
                auVar94._24_4_ = 0xc2b0c0a5;
                auVar94._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar94);
                auVar248._8_4_ = 0x3fb8aa3b;
                auVar248._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar248._12_4_ = 0x3fb8aa3b;
                auVar248._16_4_ = 0x3fb8aa3b;
                auVar248._20_4_ = 0x3fb8aa3b;
                auVar248._24_4_ = 0x3fb8aa3b;
                auVar248._28_4_ = 0x3fb8aa3b;
                auVar210 = vfmadd213ps_fma(auVar248,auVar292,auVar429);
                auVar244 = vroundps_avx(ZEXT1632(auVar210),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar210),auVar244,1);
                auVar171 = vandps_avx(auVar435,auVar171);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar141 = vfnmadd231ps_fma(auVar292,auVar171,auVar415);
                auVar292 = ZEXT1632(auVar141);
                fVar8 = auVar141._0_4_;
                fVar9 = auVar141._4_4_;
                fVar10 = auVar141._8_4_;
                fVar12 = auVar141._12_4_;
                auVar16._28_4_ = auVar244._28_4_;
                auVar16._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar10 * fVar10,
                                                 CONCAT44(fVar9 * fVar9,fVar8 * fVar8))));
                auVar210 = vfmadd213ps_fma(auVar441,auVar292,auVar447);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar453);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar459);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar465);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar429);
                auVar172._0_4_ = fVar8 + 1.0;
                auVar172._4_4_ = fVar9 + 1.0;
                auVar172._8_4_ = fVar10 + 1.0;
                auVar172._12_4_ = fVar12 + 1.0;
                auVar172._16_4_ = 0x3f800000;
                auVar172._20_4_ = 0x3f800000;
                auVar172._24_4_ = 0x3f800000;
                auVar172._28_4_ = 0x3f800000;
                auVar210 = vfmadd231ps_fma(auVar172,auVar16,ZEXT1632(auVar210));
                auVar249._0_4_ = (int)auVar171._0_4_;
                auVar249._4_4_ = (int)auVar171._4_4_;
                auVar249._8_4_ = (int)auVar171._8_4_;
                auVar249._12_4_ = (int)auVar171._12_4_;
                auVar249._16_4_ = (int)auVar171._16_4_;
                auVar249._20_4_ = (int)auVar171._20_4_;
                auVar249._24_4_ = (int)auVar171._24_4_;
                auVar249._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar249,0x17);
                auVar171 = vpaddd_avx2(auVar171,auVar389);
                auVar210 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar210),auVar435);
                auVar171 = vrcpps_avx(ZEXT1632(auVar210));
                auVar210 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar171,auVar435);
                auVar210 = vfnmadd132ps_fma(ZEXT1632(auVar210),auVar171,auVar171);
                auVar210 = vfnmadd213ps_fma(ZEXT1632(auVar210),auVar368,auVar423);
                auVar95._0_4_ = auVar210._0_4_ * local_158._0_4_;
                auVar95._4_4_ = auVar210._4_4_ * local_158._4_4_;
                auVar95._8_4_ = auVar210._8_4_ * fVar49;
                auVar95._12_4_ = auVar210._12_4_ * fVar48;
                auVar95._16_4_ = fVar11 * 0.0;
                auVar95._20_4_ = fVar265 * 0.0;
                auVar95._24_4_ = fVar264 * 0.0;
                auVar95._28_4_ = 0;
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar99._4_4_ = uVar1;
                auVar99._0_4_ = uVar1;
                auVar99._8_4_ = uVar1;
                auVar99._12_4_ = uVar1;
                auVar99._16_4_ = uVar1;
                auVar99._20_4_ = uVar1;
                auVar99._24_4_ = uVar1;
                auVar99._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar178._4_4_ = uVar1;
                auVar178._0_4_ = uVar1;
                auVar178._8_4_ = uVar1;
                auVar178._12_4_ = uVar1;
                auVar178._16_4_ = uVar1;
                auVar178._20_4_ = uVar1;
                auVar178._24_4_ = uVar1;
                auVar178._28_4_ = uVar1;
                auVar141 = vfmadd231ps_fma(auVar178,local_158,auVar99);
                auVar171 = vmaxps_avx(ZEXT1632(auVar141),ZEXT1632(auVar210));
                auVar179._8_4_ = 0x3f800000;
                auVar179._0_8_ = 0x3f8000003f800000;
                auVar179._12_4_ = 0x3f800000;
                auVar179._16_4_ = 0x3f800000;
                auVar179._20_4_ = 0x3f800000;
                auVar179._24_4_ = 0x3f800000;
                auVar179._28_4_ = 0x3f800000;
                auVar171 = vminps_avx(auVar171,auVar179);
                auVar95._4_4_ = auVar171._4_4_ * local_158._4_4_;
                auVar95._0_4_ = auVar171._0_4_ * local_158._0_4_;
                auVar95._8_4_ = auVar171._8_4_ * fVar49;
                auVar95._12_4_ = auVar171._12_4_ * fVar48;
                auVar95._16_4_ = auVar171._16_4_ * fVar11;
                auVar95._20_4_ = auVar171._20_4_ * fVar265;
                auVar95._24_4_ = auVar171._24_4_ * fVar264;
                auVar95._28_4_ = auVar171._28_4_;
              }
            }
            *pauVar32 = auVar95;
            pauVar32 = pauVar32 + 1;
          }
        }
      }
      if ((iVar2 == 1) && (_elempack == 8)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        uVar35 = 0;
        if (0 < iVar44) {
          uVar35 = uVar29;
        }
        for (uVar34 = 0; uVar34 != uVar35; uVar34 = uVar34 + 1) {
          pauVar32 = (undefined1 (*) [32])
                     ((long)top_blob->w * uVar34 * top_blob->elemsize + (long)top_blob->data);
          for (iVar37 = 0; iVar37 <= iVar31; iVar37 = iVar37 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              local_158 = ZEXT1632(ZEXT816(0) << 0x40);
            }
            else {
              local_158 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0x190 +
                                     (long)this->_vptr_Convolution1D_x86_avx2[-3]) + uVar34 * 0x20);
            }
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar34);
            pauVar38 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            for (uVar39 = 0; uVar39 != uVar45; uVar39 = uVar39 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              puVar40 = (undefined4 *)
                        ((long)bottom_blob_bordered.data +
                        (long)iVar37 * (long)*(int *)(&this->field_0xdc + (long)p_Var4) * 4 +
                        (long)bottom_blob_bordered.w *
                        CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                 (undefined4)bottom_blob_bordered.elemsize) * uVar39);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar42 = 0;
              }
              while (bVar47 = iVar42 != 0, iVar42 = iVar42 + -1, bVar47) {
                uVar1 = *puVar40;
                auVar100._4_4_ = uVar1;
                auVar100._0_4_ = uVar1;
                auVar100._8_4_ = uVar1;
                auVar100._12_4_ = uVar1;
                auVar100._16_4_ = uVar1;
                auVar100._20_4_ = uVar1;
                auVar100._24_4_ = uVar1;
                auVar100._28_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(local_158,auVar100,*pauVar38);
                local_158 = ZEXT1632(auVar210);
                puVar40 = puVar40 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                pauVar38 = pauVar38 + 1;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar118 = local_158;
            if (*(int *)(&this->field_0xf4 + (long)p_Var4) - 1U < 6) {
              auVar210 = ZEXT816(0) << 0x40;
              auVar118 = vmaxps_avx(local_158,ZEXT1632(auVar210));
              fVar49 = local_158._8_4_;
              fVar48 = local_158._12_4_;
              fVar11 = local_158._16_4_;
              fVar265 = local_158._20_4_;
              fVar264 = local_158._24_4_;
              switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
              case 2:
                auVar171 = vminps_avx(local_158,ZEXT1632(auVar210));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar251._4_4_ = uVar1;
                auVar251._0_4_ = uVar1;
                auVar251._8_4_ = uVar1;
                auVar251._12_4_ = uVar1;
                auVar251._16_4_ = uVar1;
                auVar251._20_4_ = uVar1;
                auVar251._24_4_ = uVar1;
                auVar251._28_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(auVar118,auVar171,auVar251);
                auVar118 = ZEXT1632(auVar210);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar114._4_4_ = uVar1;
                auVar114._0_4_ = uVar1;
                auVar114._8_4_ = uVar1;
                auVar114._12_4_ = uVar1;
                auVar114._16_4_ = uVar1;
                auVar114._20_4_ = uVar1;
                auVar114._24_4_ = uVar1;
                auVar114._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar182._4_4_ = uVar1;
                auVar182._0_4_ = uVar1;
                auVar182._8_4_ = uVar1;
                auVar182._12_4_ = uVar1;
                auVar182._16_4_ = uVar1;
                auVar182._20_4_ = uVar1;
                auVar182._24_4_ = uVar1;
                auVar182._28_4_ = uVar1;
                auVar171 = vmaxps_avx(local_158,auVar114);
                auVar118 = vminps_avx(auVar171,auVar182);
                break;
              case 4:
                auVar115._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
                auVar115._8_4_ = -fVar49;
                auVar115._12_4_ = -fVar48;
                auVar115._16_4_ = -fVar11;
                auVar115._20_4_ = -fVar265;
                auVar115._24_4_ = -fVar264;
                auVar115._28_4_ = local_158._28_4_ ^ 0x80000000;
                auVar183._8_4_ = 0x42b0c0a5;
                auVar183._0_8_ = 0x42b0c0a542b0c0a5;
                auVar183._12_4_ = 0x42b0c0a5;
                auVar183._16_4_ = 0x42b0c0a5;
                auVar183._20_4_ = 0x42b0c0a5;
                auVar183._24_4_ = 0x42b0c0a5;
                auVar183._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar115,auVar183);
                auVar184._8_4_ = 0xc2b0c0a5;
                auVar184._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar184._12_4_ = 0xc2b0c0a5;
                auVar184._16_4_ = 0xc2b0c0a5;
                auVar184._20_4_ = 0xc2b0c0a5;
                auVar184._24_4_ = 0xc2b0c0a5;
                auVar184._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar184);
                auVar185._8_4_ = 0x3fb8aa3b;
                auVar185._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar185._12_4_ = 0x3fb8aa3b;
                auVar185._16_4_ = 0x3fb8aa3b;
                auVar185._20_4_ = 0x3fb8aa3b;
                auVar185._24_4_ = 0x3fb8aa3b;
                auVar185._28_4_ = 0x3fb8aa3b;
                auVar330._8_4_ = 0x3f000000;
                auVar330._0_8_ = 0x3f0000003f000000;
                auVar330._12_4_ = 0x3f000000;
                auVar330._16_4_ = 0x3f000000;
                auVar330._20_4_ = 0x3f000000;
                auVar330._24_4_ = 0x3f000000;
                auVar330._28_4_ = 0x3f000000;
                auVar210 = vfmadd213ps_fma(auVar185,auVar292,auVar330);
                auVar244 = vroundps_avx(ZEXT1632(auVar210),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar210),auVar244,1);
                auVar371._8_4_ = 0x3f800000;
                auVar371._0_8_ = 0x3f8000003f800000;
                auVar371._12_4_ = 0x3f800000;
                auVar371._16_4_ = 0x3f800000;
                auVar371._20_4_ = 0x3f800000;
                auVar371._24_4_ = 0x3f800000;
                auVar371._28_4_ = 0x3f800000;
                auVar171 = vandps_avx(auVar171,auVar371);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar256._8_4_ = 0xbf317218;
                auVar256._0_8_ = 0xbf317218bf317218;
                auVar256._12_4_ = 0xbf317218;
                auVar256._16_4_ = 0xbf317218;
                auVar256._20_4_ = 0xbf317218;
                auVar256._24_4_ = 0xbf317218;
                auVar256._28_4_ = 0xbf317218;
                auVar141 = vfmadd231ps_fma(auVar292,auVar171,auVar256);
                auVar292 = ZEXT1632(auVar141);
                fVar49 = auVar141._0_4_;
                fVar48 = auVar141._4_4_;
                fVar11 = auVar141._8_4_;
                fVar265 = auVar141._12_4_;
                auVar22._28_4_ = 0xbf317218;
                auVar22._0_28_ =
                     ZEXT1628(CONCAT412(fVar265 * fVar265,
                                        CONCAT48(fVar11 * fVar11,
                                                 CONCAT44(fVar48 * fVar48,fVar49 * fVar49))));
                auVar294._8_4_ = 0x39506967;
                auVar294._0_8_ = 0x3950696739506967;
                auVar294._12_4_ = 0x39506967;
                auVar294._16_4_ = 0x39506967;
                auVar294._20_4_ = 0x39506967;
                auVar294._24_4_ = 0x39506967;
                auVar294._28_4_ = 0x39506967;
                auVar396._8_4_ = 0x3ab743ce;
                auVar396._0_8_ = 0x3ab743ce3ab743ce;
                auVar396._12_4_ = 0x3ab743ce;
                auVar396._16_4_ = 0x3ab743ce;
                auVar396._20_4_ = 0x3ab743ce;
                auVar396._24_4_ = 0x3ab743ce;
                auVar396._28_4_ = 0x3ab743ce;
                auVar210 = vfmadd213ps_fma(auVar294,auVar292,auVar396);
                auVar397._8_4_ = 0x3c088908;
                auVar397._0_8_ = 0x3c0889083c088908;
                auVar397._12_4_ = 0x3c088908;
                auVar397._16_4_ = 0x3c088908;
                auVar397._20_4_ = 0x3c088908;
                auVar397._24_4_ = 0x3c088908;
                auVar397._28_4_ = 0x3c088908;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar397);
                auVar398._8_4_ = 0x3d2aa9c1;
                auVar398._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar398._12_4_ = 0x3d2aa9c1;
                auVar398._16_4_ = 0x3d2aa9c1;
                auVar398._20_4_ = 0x3d2aa9c1;
                auVar398._24_4_ = 0x3d2aa9c1;
                auVar398._28_4_ = 0x3d2aa9c1;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar398);
                auVar399._8_4_ = 0x3e2aaaaa;
                auVar399._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar399._12_4_ = 0x3e2aaaaa;
                auVar399._16_4_ = 0x3e2aaaaa;
                auVar399._20_4_ = 0x3e2aaaaa;
                auVar399._24_4_ = 0x3e2aaaaa;
                auVar399._28_4_ = 0x3e2aaaaa;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar399);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar330);
                auVar331._0_4_ = fVar49 + 1.0;
                auVar331._4_4_ = fVar48 + 1.0;
                auVar331._8_4_ = fVar11 + 1.0;
                auVar331._12_4_ = fVar265 + 1.0;
                auVar331._16_4_ = 0x3f800000;
                auVar331._20_4_ = 0x3f800000;
                auVar331._24_4_ = 0x3f800000;
                auVar331._28_4_ = 0x3f800000;
                auVar210 = vfmadd231ps_fma(auVar331,auVar22,ZEXT1632(auVar210));
                auVar116._0_4_ = (int)auVar171._0_4_;
                auVar116._4_4_ = (int)auVar171._4_4_;
                auVar116._8_4_ = (int)auVar171._8_4_;
                auVar116._12_4_ = (int)auVar171._12_4_;
                auVar116._16_4_ = (int)auVar171._16_4_;
                auVar116._20_4_ = (int)auVar171._20_4_;
                auVar116._24_4_ = (int)auVar171._24_4_;
                auVar116._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar116,0x17);
                auVar186._8_4_ = 0x3f800000;
                auVar186._0_8_ = 0x3f8000003f800000;
                auVar186._12_4_ = 0x3f800000;
                auVar186._16_4_ = 0x3f800000;
                auVar186._20_4_ = 0x3f800000;
                auVar186._24_4_ = 0x3f800000;
                auVar186._28_4_ = 0x3f800000;
                auVar171 = vpaddd_avx2(auVar171,auVar186);
                auVar210 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar210),auVar371);
                auVar171 = vrcpps_avx(ZEXT1632(auVar210));
                auVar210 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar171,auVar371);
                auVar210 = vfnmadd132ps_fma(ZEXT1632(auVar210),auVar171,auVar171);
                auVar118 = ZEXT1632(auVar210);
                break;
              case 5:
                auVar394._8_4_ = 0x42b0c0a5;
                auVar394._0_8_ = 0x42b0c0a542b0c0a5;
                auVar394._12_4_ = 0x42b0c0a5;
                auVar394._16_4_ = 0x42b0c0a5;
                auVar394._20_4_ = 0x42b0c0a5;
                auVar394._24_4_ = 0x42b0c0a5;
                auVar394._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(local_158,auVar394);
                auVar416._8_4_ = 0xc2b0c0a5;
                auVar416._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar416._12_4_ = 0xc2b0c0a5;
                auVar416._16_4_ = 0xc2b0c0a5;
                auVar416._20_4_ = 0xc2b0c0a5;
                auVar416._24_4_ = 0xc2b0c0a5;
                auVar416._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar416);
                auVar180._8_4_ = 0x3fb8aa3b;
                auVar180._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar180._12_4_ = 0x3fb8aa3b;
                auVar180._16_4_ = 0x3fb8aa3b;
                auVar180._20_4_ = 0x3fb8aa3b;
                auVar180._24_4_ = 0x3fb8aa3b;
                auVar180._28_4_ = 0x3fb8aa3b;
                auVar430._8_4_ = 0x3f000000;
                auVar430._0_8_ = 0x3f0000003f000000;
                auVar430._12_4_ = 0x3f000000;
                auVar430._16_4_ = 0x3f000000;
                auVar430._20_4_ = 0x3f000000;
                auVar430._24_4_ = 0x3f000000;
                auVar430._28_4_ = 0x3f000000;
                auVar141 = vfmadd213ps_fma(auVar180,auVar292,auVar430);
                auVar244 = vroundps_avx(ZEXT1632(auVar141),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar141),auVar244,1);
                auVar436._8_4_ = 0x3f800000;
                auVar436._0_8_ = 0x3f8000003f800000;
                auVar436._12_4_ = 0x3f800000;
                auVar436._16_4_ = 0x3f800000;
                auVar436._20_4_ = 0x3f800000;
                auVar436._24_4_ = 0x3f800000;
                auVar436._28_4_ = 0x3f800000;
                auVar171 = vandps_avx(auVar436,auVar171);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar417._8_4_ = 0x3f317218;
                auVar417._0_8_ = 0x3f3172183f317218;
                auVar417._12_4_ = 0x3f317218;
                auVar417._16_4_ = 0x3f317218;
                auVar417._20_4_ = 0x3f317218;
                auVar417._24_4_ = 0x3f317218;
                auVar417._28_4_ = 0x3f317218;
                auVar300 = vfnmadd231ps_fma(auVar292,auVar171,auVar417);
                auVar292 = ZEXT1632(auVar300);
                fVar8 = auVar300._0_4_;
                fVar9 = auVar300._4_4_;
                fVar10 = auVar300._8_4_;
                fVar12 = auVar300._12_4_;
                auVar18._28_4_ = auVar244._28_4_;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar10 * fVar10,
                                                 CONCAT44(fVar9 * fVar9,fVar8 * fVar8))));
                auVar442._8_4_ = 0x39506967;
                auVar442._0_8_ = 0x3950696739506967;
                auVar442._12_4_ = 0x39506967;
                auVar442._16_4_ = 0x39506967;
                auVar442._20_4_ = 0x39506967;
                auVar442._24_4_ = 0x39506967;
                auVar442._28_4_ = 0x39506967;
                auVar448._8_4_ = 0x3ab743ce;
                auVar448._0_8_ = 0x3ab743ce3ab743ce;
                auVar448._12_4_ = 0x3ab743ce;
                auVar448._16_4_ = 0x3ab743ce;
                auVar448._20_4_ = 0x3ab743ce;
                auVar448._24_4_ = 0x3ab743ce;
                auVar448._28_4_ = 0x3ab743ce;
                auVar141 = vfmadd213ps_fma(auVar442,auVar292,auVar448);
                auVar454._8_4_ = 0x3c088908;
                auVar454._0_8_ = 0x3c0889083c088908;
                auVar454._12_4_ = 0x3c088908;
                auVar454._16_4_ = 0x3c088908;
                auVar454._20_4_ = 0x3c088908;
                auVar454._24_4_ = 0x3c088908;
                auVar454._28_4_ = 0x3c088908;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),auVar292,auVar454);
                auVar460._8_4_ = 0x3d2aa9c1;
                auVar460._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar460._12_4_ = 0x3d2aa9c1;
                auVar460._16_4_ = 0x3d2aa9c1;
                auVar460._20_4_ = 0x3d2aa9c1;
                auVar460._24_4_ = 0x3d2aa9c1;
                auVar460._28_4_ = 0x3d2aa9c1;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),auVar292,auVar460);
                auVar466._8_4_ = 0x3e2aaaaa;
                auVar466._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar466._12_4_ = 0x3e2aaaaa;
                auVar466._16_4_ = 0x3e2aaaaa;
                auVar466._20_4_ = 0x3e2aaaaa;
                auVar466._24_4_ = 0x3e2aaaaa;
                auVar466._28_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar300),auVar466);
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar300),auVar430);
                auVar325._0_4_ = fVar8 + 1.0;
                auVar325._4_4_ = fVar9 + 1.0;
                auVar325._8_4_ = fVar10 + 1.0;
                auVar325._12_4_ = fVar12 + 1.0;
                auVar325._16_4_ = 0x3f800000;
                auVar325._20_4_ = 0x3f800000;
                auVar325._24_4_ = 0x3f800000;
                auVar325._28_4_ = 0x3f800000;
                auVar141 = vfmadd231ps_fma(auVar325,auVar18,ZEXT1632(auVar141));
                auVar101._0_4_ = (int)auVar171._0_4_;
                auVar101._4_4_ = (int)auVar171._4_4_;
                auVar101._8_4_ = (int)auVar171._8_4_;
                auVar101._12_4_ = (int)auVar171._12_4_;
                auVar101._16_4_ = (int)auVar171._16_4_;
                auVar101._20_4_ = (int)auVar171._20_4_;
                auVar101._24_4_ = (int)auVar171._24_4_;
                auVar101._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar101,0x17);
                auVar395._8_4_ = 0x3f800000;
                auVar395._0_8_ = 0x3f8000003f800000;
                auVar395._12_4_ = 0x3f800000;
                auVar395._16_4_ = 0x3f800000;
                auVar395._20_4_ = 0x3f800000;
                auVar395._24_4_ = 0x3f800000;
                auVar395._28_4_ = 0x3f800000;
                auVar171 = vpaddd_avx2(auVar171,auVar395);
                auVar141 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar141),auVar436);
                auVar252._8_4_ = 0x800000;
                auVar252._0_8_ = 0x80000000800000;
                auVar252._12_4_ = 0x800000;
                auVar252._16_4_ = 0x800000;
                auVar252._20_4_ = 0x800000;
                auVar252._24_4_ = 0x800000;
                auVar252._28_4_ = 0x800000;
                auVar171 = vmaxps_avx(ZEXT1632(auVar141),auVar252);
                auVar292 = vpsrld_avx2(auVar171,0x17);
                auVar326._8_4_ = 0x807fffff;
                auVar326._0_8_ = 0x807fffff807fffff;
                auVar326._12_4_ = 0x807fffff;
                auVar326._16_4_ = 0x807fffff;
                auVar326._20_4_ = 0x807fffff;
                auVar326._24_4_ = 0x807fffff;
                auVar326._28_4_ = 0x807fffff;
                auVar171 = vandps_avx(auVar171,auVar326);
                auVar327._8_4_ = 0x3f000000;
                auVar327._0_8_ = 0x3f0000003f000000;
                auVar327._12_4_ = 0x3f000000;
                auVar327._16_4_ = 0x3f000000;
                auVar327._20_4_ = 0x3f000000;
                auVar327._24_4_ = 0x3f000000;
                auVar327._28_4_ = 0x3f000000;
                auVar244 = vorps_avx(auVar171,auVar327);
                auVar328._8_4_ = 0xffffff82;
                auVar328._0_8_ = 0xffffff82ffffff82;
                auVar328._12_4_ = 0xffffff82;
                auVar328._16_4_ = 0xffffff82;
                auVar328._20_4_ = 0xffffff82;
                auVar328._24_4_ = 0xffffff82;
                auVar328._28_4_ = 0xffffff82;
                auVar291 = vpaddd_avx2(auVar292,auVar328);
                auVar102._8_4_ = 0x3f3504f3;
                auVar102._0_8_ = 0x3f3504f33f3504f3;
                auVar102._12_4_ = 0x3f3504f3;
                auVar102._16_4_ = 0x3f3504f3;
                auVar102._20_4_ = 0x3f3504f3;
                auVar102._24_4_ = 0x3f3504f3;
                auVar102._28_4_ = 0x3f3504f3;
                auVar292 = vcmpps_avx(auVar244,auVar102,1);
                auVar171 = vandps_avx(auVar292,auVar244);
                auVar424._8_4_ = 0xbf800000;
                auVar424._0_8_ = 0xbf800000bf800000;
                auVar424._12_4_ = 0xbf800000;
                auVar424._16_4_ = 0xbf800000;
                auVar424._20_4_ = 0xbf800000;
                auVar424._24_4_ = 0xbf800000;
                auVar424._28_4_ = 0xbf800000;
                auVar253._0_4_ = auVar244._0_4_ + -1.0 + auVar171._0_4_;
                auVar253._4_4_ = auVar244._4_4_ + -1.0 + auVar171._4_4_;
                auVar253._8_4_ = auVar244._8_4_ + -1.0 + auVar171._8_4_;
                auVar253._12_4_ = auVar244._12_4_ + -1.0 + auVar171._12_4_;
                auVar253._16_4_ = auVar244._16_4_ + -1.0 + auVar171._16_4_;
                auVar253._20_4_ = auVar244._20_4_ + -1.0 + auVar171._20_4_;
                auVar253._24_4_ = auVar244._24_4_ + -1.0 + auVar171._24_4_;
                auVar253._28_4_ = auVar244._28_4_ + -1.0 + auVar171._28_4_;
                auVar244 = vcmpps_avx(ZEXT1632(auVar141),ZEXT1632(auVar210),2);
                auVar291 = vcvtdq2ps_avx(auVar291);
                auVar171 = vandps_avx(auVar436,auVar292);
                auVar171 = vsubps_avx(auVar291,auVar171);
                auVar329._8_4_ = 0x3d9021bb;
                auVar329._0_8_ = 0x3d9021bb3d9021bb;
                auVar329._12_4_ = 0x3d9021bb;
                auVar329._16_4_ = 0x3d9021bb;
                auVar329._20_4_ = 0x3d9021bb;
                auVar329._24_4_ = 0x3d9021bb;
                auVar329._28_4_ = 0x3d9021bb;
                auVar103._8_4_ = 0xbdebd1b8;
                auVar103._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar103._12_4_ = 0xbdebd1b8;
                auVar103._16_4_ = 0xbdebd1b8;
                auVar103._20_4_ = 0xbdebd1b8;
                auVar103._24_4_ = 0xbdebd1b8;
                auVar103._28_4_ = 0xbdebd1b8;
                auVar210 = vfmadd213ps_fma(auVar329,auVar253,auVar103);
                auVar104._8_4_ = 0x3def251a;
                auVar104._0_8_ = 0x3def251a3def251a;
                auVar104._12_4_ = 0x3def251a;
                auVar104._16_4_ = 0x3def251a;
                auVar104._20_4_ = 0x3def251a;
                auVar104._24_4_ = 0x3def251a;
                auVar104._28_4_ = 0x3def251a;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar253,auVar104);
                auVar105._8_4_ = 0xbdfe5d4f;
                auVar105._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar105._12_4_ = 0xbdfe5d4f;
                auVar105._16_4_ = 0xbdfe5d4f;
                auVar105._20_4_ = 0xbdfe5d4f;
                auVar105._24_4_ = 0xbdfe5d4f;
                auVar105._28_4_ = 0xbdfe5d4f;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar253,auVar105);
                auVar106._8_4_ = 0x3e11e9bf;
                auVar106._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar106._12_4_ = 0x3e11e9bf;
                auVar106._16_4_ = 0x3e11e9bf;
                auVar106._20_4_ = 0x3e11e9bf;
                auVar106._24_4_ = 0x3e11e9bf;
                auVar106._28_4_ = 0x3e11e9bf;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar253,auVar106);
                auVar107._8_4_ = 0xbe2aae50;
                auVar107._0_8_ = 0xbe2aae50be2aae50;
                auVar107._12_4_ = 0xbe2aae50;
                auVar107._16_4_ = 0xbe2aae50;
                auVar107._20_4_ = 0xbe2aae50;
                auVar107._24_4_ = 0xbe2aae50;
                auVar107._28_4_ = 0xbe2aae50;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar253,auVar107);
                auVar108._8_4_ = 0x3e4cceac;
                auVar108._0_8_ = 0x3e4cceac3e4cceac;
                auVar108._12_4_ = 0x3e4cceac;
                auVar108._16_4_ = 0x3e4cceac;
                auVar108._20_4_ = 0x3e4cceac;
                auVar108._24_4_ = 0x3e4cceac;
                auVar108._28_4_ = 0x3e4cceac;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar253,auVar108);
                auVar109._8_4_ = 0xbe7ffffc;
                auVar109._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar109._12_4_ = 0xbe7ffffc;
                auVar109._16_4_ = 0xbe7ffffc;
                auVar109._20_4_ = 0xbe7ffffc;
                auVar109._24_4_ = 0xbe7ffffc;
                auVar109._28_4_ = 0xbe7ffffc;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar253,auVar109);
                auVar110._8_4_ = 0x3eaaaaaa;
                auVar110._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar110._12_4_ = 0x3eaaaaaa;
                auVar110._16_4_ = 0x3eaaaaaa;
                auVar110._20_4_ = 0x3eaaaaaa;
                auVar110._24_4_ = 0x3eaaaaaa;
                auVar110._28_4_ = 0x3eaaaaaa;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar253,auVar110);
                auVar141 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar253,auVar430);
                auVar210 = vfmadd213ps_fma(auVar171,auVar417,auVar253);
                auVar19._4_4_ = auVar253._4_4_ * auVar253._4_4_;
                auVar19._0_4_ = auVar253._0_4_ * auVar253._0_4_;
                auVar19._8_4_ = auVar253._8_4_ * auVar253._8_4_;
                auVar19._12_4_ = auVar253._12_4_ * auVar253._12_4_;
                auVar19._16_4_ = auVar253._16_4_ * auVar253._16_4_;
                auVar19._20_4_ = auVar253._20_4_ * auVar253._20_4_;
                auVar19._24_4_ = auVar253._24_4_ * auVar253._24_4_;
                auVar19._28_4_ = auVar253._28_4_;
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar19,ZEXT1632(auVar141));
                auVar370._8_4_ = 0xc0000000;
                auVar370._0_8_ = 0xc0000000c0000000;
                auVar370._12_4_ = 0xc0000000;
                auVar370._16_4_ = 0xc0000000;
                auVar370._20_4_ = 0xc0000000;
                auVar370._24_4_ = 0xc0000000;
                auVar370._28_4_ = 0xc0000000;
                auVar20._4_4_ = auVar210._4_4_ * -2.0;
                auVar20._0_4_ = auVar210._0_4_ * -2.0;
                auVar20._8_4_ = auVar210._8_4_ * -2.0;
                auVar20._12_4_ = auVar210._12_4_ * -2.0;
                auVar20._16_4_ = 0x80000000;
                auVar20._20_4_ = 0x80000000;
                auVar20._24_4_ = 0x80000000;
                auVar20._28_4_ = auVar253._28_4_;
                auVar111._8_4_ = 0x7fffffff;
                auVar111._0_8_ = 0x7fffffff7fffffff;
                auVar111._12_4_ = 0x7fffffff;
                auVar111._16_4_ = 0x7fffffff;
                auVar111._20_4_ = 0x7fffffff;
                auVar111._24_4_ = 0x7fffffff;
                auVar111._28_4_ = 0x7fffffff;
                auVar171 = vblendvps_avx(auVar20,auVar111,auVar244);
                auVar112._8_4_ = 0x42b0c0a5;
                auVar112._0_8_ = 0x42b0c0a542b0c0a5;
                auVar112._12_4_ = 0x42b0c0a5;
                auVar112._16_4_ = 0x42b0c0a5;
                auVar112._20_4_ = 0x42b0c0a5;
                auVar112._24_4_ = 0x42b0c0a5;
                auVar112._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar112);
                auVar113._8_4_ = 0xc2b0c0a5;
                auVar113._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar113._12_4_ = 0xc2b0c0a5;
                auVar113._16_4_ = 0xc2b0c0a5;
                auVar113._20_4_ = 0xc2b0c0a5;
                auVar113._24_4_ = 0xc2b0c0a5;
                auVar113._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar113);
                auVar254._8_4_ = 0x3fb8aa3b;
                auVar254._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar254._12_4_ = 0x3fb8aa3b;
                auVar254._16_4_ = 0x3fb8aa3b;
                auVar254._20_4_ = 0x3fb8aa3b;
                auVar254._24_4_ = 0x3fb8aa3b;
                auVar254._28_4_ = 0x3fb8aa3b;
                auVar210 = vfmadd213ps_fma(auVar254,auVar292,auVar430);
                auVar244 = vroundps_avx(ZEXT1632(auVar210),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar210),auVar244,1);
                auVar171 = vandps_avx(auVar436,auVar171);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar141 = vfnmadd231ps_fma(auVar292,auVar171,auVar417);
                auVar292 = ZEXT1632(auVar141);
                fVar8 = auVar141._0_4_;
                fVar9 = auVar141._4_4_;
                fVar10 = auVar141._8_4_;
                fVar12 = auVar141._12_4_;
                auVar21._28_4_ = auVar244._28_4_;
                auVar21._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar10 * fVar10,
                                                 CONCAT44(fVar9 * fVar9,fVar8 * fVar8))));
                auVar210 = vfmadd213ps_fma(auVar442,auVar292,auVar448);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar454);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar460);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar466);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar430);
                auVar181._0_4_ = fVar8 + 1.0;
                auVar181._4_4_ = fVar9 + 1.0;
                auVar181._8_4_ = fVar10 + 1.0;
                auVar181._12_4_ = fVar12 + 1.0;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar210 = vfmadd231ps_fma(auVar181,auVar21,ZEXT1632(auVar210));
                auVar255._0_4_ = (int)auVar171._0_4_;
                auVar255._4_4_ = (int)auVar171._4_4_;
                auVar255._8_4_ = (int)auVar171._8_4_;
                auVar255._12_4_ = (int)auVar171._12_4_;
                auVar255._16_4_ = (int)auVar171._16_4_;
                auVar255._20_4_ = (int)auVar171._20_4_;
                auVar255._24_4_ = (int)auVar171._24_4_;
                auVar255._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar255,0x17);
                auVar171 = vpaddd_avx2(auVar171,auVar395);
                auVar210 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar210),auVar436);
                auVar171 = vrcpps_avx(ZEXT1632(auVar210));
                auVar210 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar171,auVar436);
                auVar210 = vfnmadd132ps_fma(ZEXT1632(auVar210),auVar171,auVar171);
                auVar210 = vfnmadd213ps_fma(ZEXT1632(auVar210),auVar370,auVar424);
                auVar118._0_4_ = auVar210._0_4_ * local_158._0_4_;
                auVar118._4_4_ = auVar210._4_4_ * local_158._4_4_;
                auVar118._8_4_ = auVar210._8_4_ * fVar49;
                auVar118._12_4_ = auVar210._12_4_ * fVar48;
                auVar118._16_4_ = fVar11 * 0.0;
                auVar118._20_4_ = fVar265 * 0.0;
                auVar118._24_4_ = fVar264 * 0.0;
                auVar118._28_4_ = 0;
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar117._4_4_ = uVar1;
                auVar117._0_4_ = uVar1;
                auVar117._8_4_ = uVar1;
                auVar117._12_4_ = uVar1;
                auVar117._16_4_ = uVar1;
                auVar117._20_4_ = uVar1;
                auVar117._24_4_ = uVar1;
                auVar117._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar187._4_4_ = uVar1;
                auVar187._0_4_ = uVar1;
                auVar187._8_4_ = uVar1;
                auVar187._12_4_ = uVar1;
                auVar187._16_4_ = uVar1;
                auVar187._20_4_ = uVar1;
                auVar187._24_4_ = uVar1;
                auVar187._28_4_ = uVar1;
                auVar141 = vfmadd231ps_fma(auVar187,local_158,auVar117);
                auVar171 = vmaxps_avx(ZEXT1632(auVar141),ZEXT1632(auVar210));
                auVar188._8_4_ = 0x3f800000;
                auVar188._0_8_ = 0x3f8000003f800000;
                auVar188._12_4_ = 0x3f800000;
                auVar188._16_4_ = 0x3f800000;
                auVar188._20_4_ = 0x3f800000;
                auVar188._24_4_ = 0x3f800000;
                auVar188._28_4_ = 0x3f800000;
                auVar171 = vminps_avx(auVar171,auVar188);
                auVar118._4_4_ = auVar171._4_4_ * local_158._4_4_;
                auVar118._0_4_ = auVar171._0_4_ * local_158._0_4_;
                auVar118._8_4_ = auVar171._8_4_ * fVar49;
                auVar118._12_4_ = auVar171._12_4_ * fVar48;
                auVar118._16_4_ = auVar171._16_4_ * fVar11;
                auVar118._20_4_ = auVar171._20_4_ * fVar265;
                auVar118._24_4_ = auVar171._24_4_ * fVar264;
                auVar118._28_4_ = auVar171._28_4_;
              }
            }
            *pauVar32 = auVar118;
            pauVar32 = pauVar32 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 8)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        uVar35 = 0;
        if (0 < iVar44) {
          uVar35 = uVar29;
        }
        for (uVar34 = 0; uVar34 != uVar35; uVar34 = uVar34 + 1) {
          pauVar32 = (undefined1 (*) [32])
                     ((long)top_blob->w * uVar34 * top_blob->elemsize + (long)top_blob->data);
          for (iVar37 = 0; iVar37 <= iVar31; iVar37 = iVar37 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              local_158 = ZEXT1632(ZEXT816(0) << 0x40);
            }
            else {
              local_158 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0x190 +
                                     (long)this->_vptr_Convolution1D_x86_avx2[-3]) + uVar34 * 0x20);
            }
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar34);
            pauVar38 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            for (uVar39 = 0; uVar39 != uVar45; uVar39 = uVar39 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              puVar40 = (undefined4 *)
                        ((long)bottom_blob_bordered.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar37 * 4) * 4 +
                        (long)bottom_blob_bordered.w *
                        CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                 (undefined4)bottom_blob_bordered.elemsize) * uVar39);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar42 = 0;
              }
              while (bVar47 = iVar42 != 0, iVar42 = iVar42 + -1, bVar47) {
                uVar1 = *puVar40;
                auVar119._4_4_ = uVar1;
                auVar119._0_4_ = uVar1;
                auVar119._8_4_ = uVar1;
                auVar119._12_4_ = uVar1;
                auVar119._16_4_ = uVar1;
                auVar119._20_4_ = uVar1;
                auVar119._24_4_ = uVar1;
                auVar119._28_4_ = uVar1;
                uVar1 = puVar40[1];
                auVar189._4_4_ = uVar1;
                auVar189._0_4_ = uVar1;
                auVar189._8_4_ = uVar1;
                auVar189._12_4_ = uVar1;
                auVar189._16_4_ = uVar1;
                auVar189._20_4_ = uVar1;
                auVar189._24_4_ = uVar1;
                auVar189._28_4_ = uVar1;
                uVar1 = puVar40[2];
                auVar257._4_4_ = uVar1;
                auVar257._0_4_ = uVar1;
                auVar257._8_4_ = uVar1;
                auVar257._12_4_ = uVar1;
                auVar257._16_4_ = uVar1;
                auVar257._20_4_ = uVar1;
                auVar257._24_4_ = uVar1;
                auVar257._28_4_ = uVar1;
                uVar1 = puVar40[3];
                auVar295._4_4_ = uVar1;
                auVar295._0_4_ = uVar1;
                auVar295._8_4_ = uVar1;
                auVar295._12_4_ = uVar1;
                auVar295._16_4_ = uVar1;
                auVar295._20_4_ = uVar1;
                auVar295._24_4_ = uVar1;
                auVar295._28_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(local_158,auVar119,*pauVar38);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar189,pauVar38[1]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar257,pauVar38[2]);
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar295,pauVar38[3]);
                local_158 = ZEXT1632(auVar210);
                puVar40 = puVar40 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 4;
                pauVar38 = pauVar38 + 4;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar133 = local_158;
            if (*(int *)(&this->field_0xf4 + (long)p_Var4) - 1U < 6) {
              auVar210 = ZEXT816(0) << 0x40;
              auVar133 = vmaxps_avx(local_158,ZEXT1632(auVar210));
              fVar49 = local_158._8_4_;
              fVar48 = local_158._12_4_;
              fVar11 = local_158._16_4_;
              fVar265 = local_158._20_4_;
              fVar264 = local_158._24_4_;
              switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
              case 2:
                auVar171 = vminps_avx(local_158,ZEXT1632(auVar210));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar258._4_4_ = uVar1;
                auVar258._0_4_ = uVar1;
                auVar258._8_4_ = uVar1;
                auVar258._12_4_ = uVar1;
                auVar258._16_4_ = uVar1;
                auVar258._20_4_ = uVar1;
                auVar258._24_4_ = uVar1;
                auVar258._28_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(auVar133,auVar171,auVar258);
                auVar133 = ZEXT1632(auVar210);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar134._4_4_ = uVar1;
                auVar134._0_4_ = uVar1;
                auVar134._8_4_ = uVar1;
                auVar134._12_4_ = uVar1;
                auVar134._16_4_ = uVar1;
                auVar134._20_4_ = uVar1;
                auVar134._24_4_ = uVar1;
                auVar134._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar192._4_4_ = uVar1;
                auVar192._0_4_ = uVar1;
                auVar192._8_4_ = uVar1;
                auVar192._12_4_ = uVar1;
                auVar192._16_4_ = uVar1;
                auVar192._20_4_ = uVar1;
                auVar192._24_4_ = uVar1;
                auVar192._28_4_ = uVar1;
                auVar171 = vmaxps_avx(local_158,auVar134);
                auVar133 = vminps_avx(auVar171,auVar192);
                break;
              case 4:
                auVar135._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
                auVar135._8_4_ = -fVar49;
                auVar135._12_4_ = -fVar48;
                auVar135._16_4_ = -fVar11;
                auVar135._20_4_ = -fVar265;
                auVar135._24_4_ = -fVar264;
                auVar135._28_4_ = local_158._28_4_ ^ 0x80000000;
                auVar193._8_4_ = 0x42b0c0a5;
                auVar193._0_8_ = 0x42b0c0a542b0c0a5;
                auVar193._12_4_ = 0x42b0c0a5;
                auVar193._16_4_ = 0x42b0c0a5;
                auVar193._20_4_ = 0x42b0c0a5;
                auVar193._24_4_ = 0x42b0c0a5;
                auVar193._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar135,auVar193);
                auVar194._8_4_ = 0xc2b0c0a5;
                auVar194._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar194._12_4_ = 0xc2b0c0a5;
                auVar194._16_4_ = 0xc2b0c0a5;
                auVar194._20_4_ = 0xc2b0c0a5;
                auVar194._24_4_ = 0xc2b0c0a5;
                auVar194._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar194);
                auVar195._8_4_ = 0x3fb8aa3b;
                auVar195._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar195._12_4_ = 0x3fb8aa3b;
                auVar195._16_4_ = 0x3fb8aa3b;
                auVar195._20_4_ = 0x3fb8aa3b;
                auVar195._24_4_ = 0x3fb8aa3b;
                auVar195._28_4_ = 0x3fb8aa3b;
                auVar337._8_4_ = 0x3f000000;
                auVar337._0_8_ = 0x3f0000003f000000;
                auVar337._12_4_ = 0x3f000000;
                auVar337._16_4_ = 0x3f000000;
                auVar337._20_4_ = 0x3f000000;
                auVar337._24_4_ = 0x3f000000;
                auVar337._28_4_ = 0x3f000000;
                auVar210 = vfmadd213ps_fma(auVar195,auVar292,auVar337);
                auVar244 = vroundps_avx(ZEXT1632(auVar210),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar210),auVar244,1);
                auVar373._8_4_ = 0x3f800000;
                auVar373._0_8_ = 0x3f8000003f800000;
                auVar373._12_4_ = 0x3f800000;
                auVar373._16_4_ = 0x3f800000;
                auVar373._20_4_ = 0x3f800000;
                auVar373._24_4_ = 0x3f800000;
                auVar373._28_4_ = 0x3f800000;
                auVar171 = vandps_avx(auVar171,auVar373);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar263._8_4_ = 0xbf317218;
                auVar263._0_8_ = 0xbf317218bf317218;
                auVar263._12_4_ = 0xbf317218;
                auVar263._16_4_ = 0xbf317218;
                auVar263._20_4_ = 0xbf317218;
                auVar263._24_4_ = 0xbf317218;
                auVar263._28_4_ = 0xbf317218;
                auVar141 = vfmadd231ps_fma(auVar292,auVar171,auVar263);
                auVar292 = ZEXT1632(auVar141);
                fVar49 = auVar141._0_4_;
                fVar48 = auVar141._4_4_;
                fVar11 = auVar141._8_4_;
                fVar265 = auVar141._12_4_;
                auVar27._28_4_ = 0xbf317218;
                auVar27._0_28_ =
                     ZEXT1628(CONCAT412(fVar265 * fVar265,
                                        CONCAT48(fVar11 * fVar11,
                                                 CONCAT44(fVar48 * fVar48,fVar49 * fVar49))));
                auVar296._8_4_ = 0x39506967;
                auVar296._0_8_ = 0x3950696739506967;
                auVar296._12_4_ = 0x39506967;
                auVar296._16_4_ = 0x39506967;
                auVar296._20_4_ = 0x39506967;
                auVar296._24_4_ = 0x39506967;
                auVar296._28_4_ = 0x39506967;
                auVar402._8_4_ = 0x3ab743ce;
                auVar402._0_8_ = 0x3ab743ce3ab743ce;
                auVar402._12_4_ = 0x3ab743ce;
                auVar402._16_4_ = 0x3ab743ce;
                auVar402._20_4_ = 0x3ab743ce;
                auVar402._24_4_ = 0x3ab743ce;
                auVar402._28_4_ = 0x3ab743ce;
                auVar210 = vfmadd213ps_fma(auVar296,auVar292,auVar402);
                auVar403._8_4_ = 0x3c088908;
                auVar403._0_8_ = 0x3c0889083c088908;
                auVar403._12_4_ = 0x3c088908;
                auVar403._16_4_ = 0x3c088908;
                auVar403._20_4_ = 0x3c088908;
                auVar403._24_4_ = 0x3c088908;
                auVar403._28_4_ = 0x3c088908;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar403);
                auVar404._8_4_ = 0x3d2aa9c1;
                auVar404._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar404._12_4_ = 0x3d2aa9c1;
                auVar404._16_4_ = 0x3d2aa9c1;
                auVar404._20_4_ = 0x3d2aa9c1;
                auVar404._24_4_ = 0x3d2aa9c1;
                auVar404._28_4_ = 0x3d2aa9c1;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar404);
                auVar405._8_4_ = 0x3e2aaaaa;
                auVar405._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar405._12_4_ = 0x3e2aaaaa;
                auVar405._16_4_ = 0x3e2aaaaa;
                auVar405._20_4_ = 0x3e2aaaaa;
                auVar405._24_4_ = 0x3e2aaaaa;
                auVar405._28_4_ = 0x3e2aaaaa;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar405);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar337);
                auVar338._0_4_ = fVar49 + 1.0;
                auVar338._4_4_ = fVar48 + 1.0;
                auVar338._8_4_ = fVar11 + 1.0;
                auVar338._12_4_ = fVar265 + 1.0;
                auVar338._16_4_ = 0x3f800000;
                auVar338._20_4_ = 0x3f800000;
                auVar338._24_4_ = 0x3f800000;
                auVar338._28_4_ = 0x3f800000;
                auVar210 = vfmadd231ps_fma(auVar338,auVar27,ZEXT1632(auVar210));
                auVar136._0_4_ = (int)auVar171._0_4_;
                auVar136._4_4_ = (int)auVar171._4_4_;
                auVar136._8_4_ = (int)auVar171._8_4_;
                auVar136._12_4_ = (int)auVar171._12_4_;
                auVar136._16_4_ = (int)auVar171._16_4_;
                auVar136._20_4_ = (int)auVar171._20_4_;
                auVar136._24_4_ = (int)auVar171._24_4_;
                auVar136._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar136,0x17);
                auVar196._8_4_ = 0x3f800000;
                auVar196._0_8_ = 0x3f8000003f800000;
                auVar196._12_4_ = 0x3f800000;
                auVar196._16_4_ = 0x3f800000;
                auVar196._20_4_ = 0x3f800000;
                auVar196._24_4_ = 0x3f800000;
                auVar196._28_4_ = 0x3f800000;
                auVar171 = vpaddd_avx2(auVar171,auVar196);
                auVar210 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar210),auVar373);
                auVar171 = vrcpps_avx(ZEXT1632(auVar210));
                auVar210 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar171,auVar373);
                auVar210 = vfnmadd132ps_fma(ZEXT1632(auVar210),auVar171,auVar171);
                auVar133 = ZEXT1632(auVar210);
                break;
              case 5:
                auVar400._8_4_ = 0x42b0c0a5;
                auVar400._0_8_ = 0x42b0c0a542b0c0a5;
                auVar400._12_4_ = 0x42b0c0a5;
                auVar400._16_4_ = 0x42b0c0a5;
                auVar400._20_4_ = 0x42b0c0a5;
                auVar400._24_4_ = 0x42b0c0a5;
                auVar400._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(local_158,auVar400);
                auVar418._8_4_ = 0xc2b0c0a5;
                auVar418._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar418._12_4_ = 0xc2b0c0a5;
                auVar418._16_4_ = 0xc2b0c0a5;
                auVar418._20_4_ = 0xc2b0c0a5;
                auVar418._24_4_ = 0xc2b0c0a5;
                auVar418._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar418);
                auVar190._8_4_ = 0x3fb8aa3b;
                auVar190._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar190._12_4_ = 0x3fb8aa3b;
                auVar190._16_4_ = 0x3fb8aa3b;
                auVar190._20_4_ = 0x3fb8aa3b;
                auVar190._24_4_ = 0x3fb8aa3b;
                auVar190._28_4_ = 0x3fb8aa3b;
                auVar431._8_4_ = 0x3f000000;
                auVar431._0_8_ = 0x3f0000003f000000;
                auVar431._12_4_ = 0x3f000000;
                auVar431._16_4_ = 0x3f000000;
                auVar431._20_4_ = 0x3f000000;
                auVar431._24_4_ = 0x3f000000;
                auVar431._28_4_ = 0x3f000000;
                auVar141 = vfmadd213ps_fma(auVar190,auVar292,auVar431);
                auVar244 = vroundps_avx(ZEXT1632(auVar141),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar141),auVar244,1);
                auVar437._8_4_ = 0x3f800000;
                auVar437._0_8_ = 0x3f8000003f800000;
                auVar437._12_4_ = 0x3f800000;
                auVar437._16_4_ = 0x3f800000;
                auVar437._20_4_ = 0x3f800000;
                auVar437._24_4_ = 0x3f800000;
                auVar437._28_4_ = 0x3f800000;
                auVar171 = vandps_avx(auVar437,auVar171);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar419._8_4_ = 0x3f317218;
                auVar419._0_8_ = 0x3f3172183f317218;
                auVar419._12_4_ = 0x3f317218;
                auVar419._16_4_ = 0x3f317218;
                auVar419._20_4_ = 0x3f317218;
                auVar419._24_4_ = 0x3f317218;
                auVar419._28_4_ = 0x3f317218;
                auVar300 = vfnmadd231ps_fma(auVar292,auVar171,auVar419);
                auVar292 = ZEXT1632(auVar300);
                fVar8 = auVar300._0_4_;
                fVar9 = auVar300._4_4_;
                fVar10 = auVar300._8_4_;
                fVar12 = auVar300._12_4_;
                auVar23._28_4_ = auVar244._28_4_;
                auVar23._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar10 * fVar10,
                                                 CONCAT44(fVar9 * fVar9,fVar8 * fVar8))));
                auVar443._8_4_ = 0x39506967;
                auVar443._0_8_ = 0x3950696739506967;
                auVar443._12_4_ = 0x39506967;
                auVar443._16_4_ = 0x39506967;
                auVar443._20_4_ = 0x39506967;
                auVar443._24_4_ = 0x39506967;
                auVar443._28_4_ = 0x39506967;
                auVar449._8_4_ = 0x3ab743ce;
                auVar449._0_8_ = 0x3ab743ce3ab743ce;
                auVar449._12_4_ = 0x3ab743ce;
                auVar449._16_4_ = 0x3ab743ce;
                auVar449._20_4_ = 0x3ab743ce;
                auVar449._24_4_ = 0x3ab743ce;
                auVar449._28_4_ = 0x3ab743ce;
                auVar141 = vfmadd213ps_fma(auVar443,auVar292,auVar449);
                auVar455._8_4_ = 0x3c088908;
                auVar455._0_8_ = 0x3c0889083c088908;
                auVar455._12_4_ = 0x3c088908;
                auVar455._16_4_ = 0x3c088908;
                auVar455._20_4_ = 0x3c088908;
                auVar455._24_4_ = 0x3c088908;
                auVar455._28_4_ = 0x3c088908;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),auVar292,auVar455);
                auVar461._8_4_ = 0x3d2aa9c1;
                auVar461._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar461._12_4_ = 0x3d2aa9c1;
                auVar461._16_4_ = 0x3d2aa9c1;
                auVar461._20_4_ = 0x3d2aa9c1;
                auVar461._24_4_ = 0x3d2aa9c1;
                auVar461._28_4_ = 0x3d2aa9c1;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),auVar292,auVar461);
                auVar467._8_4_ = 0x3e2aaaaa;
                auVar467._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar467._12_4_ = 0x3e2aaaaa;
                auVar467._16_4_ = 0x3e2aaaaa;
                auVar467._20_4_ = 0x3e2aaaaa;
                auVar467._24_4_ = 0x3e2aaaaa;
                auVar467._28_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar300),auVar467);
                auVar141 = vfmadd213ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar300),auVar431);
                auVar332._0_4_ = fVar8 + 1.0;
                auVar332._4_4_ = fVar9 + 1.0;
                auVar332._8_4_ = fVar10 + 1.0;
                auVar332._12_4_ = fVar12 + 1.0;
                auVar332._16_4_ = 0x3f800000;
                auVar332._20_4_ = 0x3f800000;
                auVar332._24_4_ = 0x3f800000;
                auVar332._28_4_ = 0x3f800000;
                auVar141 = vfmadd231ps_fma(auVar332,auVar23,ZEXT1632(auVar141));
                auVar120._0_4_ = (int)auVar171._0_4_;
                auVar120._4_4_ = (int)auVar171._4_4_;
                auVar120._8_4_ = (int)auVar171._8_4_;
                auVar120._12_4_ = (int)auVar171._12_4_;
                auVar120._16_4_ = (int)auVar171._16_4_;
                auVar120._20_4_ = (int)auVar171._20_4_;
                auVar120._24_4_ = (int)auVar171._24_4_;
                auVar120._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar120,0x17);
                auVar401._8_4_ = 0x3f800000;
                auVar401._0_8_ = 0x3f8000003f800000;
                auVar401._12_4_ = 0x3f800000;
                auVar401._16_4_ = 0x3f800000;
                auVar401._20_4_ = 0x3f800000;
                auVar401._24_4_ = 0x3f800000;
                auVar401._28_4_ = 0x3f800000;
                auVar171 = vpaddd_avx2(auVar171,auVar401);
                auVar141 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar141),auVar437);
                auVar259._8_4_ = 0x800000;
                auVar259._0_8_ = 0x80000000800000;
                auVar259._12_4_ = 0x800000;
                auVar259._16_4_ = 0x800000;
                auVar259._20_4_ = 0x800000;
                auVar259._24_4_ = 0x800000;
                auVar259._28_4_ = 0x800000;
                auVar171 = vmaxps_avx(ZEXT1632(auVar141),auVar259);
                auVar292 = vpsrld_avx2(auVar171,0x17);
                auVar333._8_4_ = 0x807fffff;
                auVar333._0_8_ = 0x807fffff807fffff;
                auVar333._12_4_ = 0x807fffff;
                auVar333._16_4_ = 0x807fffff;
                auVar333._20_4_ = 0x807fffff;
                auVar333._24_4_ = 0x807fffff;
                auVar333._28_4_ = 0x807fffff;
                auVar171 = vandps_avx(auVar171,auVar333);
                auVar334._8_4_ = 0x3f000000;
                auVar334._0_8_ = 0x3f0000003f000000;
                auVar334._12_4_ = 0x3f000000;
                auVar334._16_4_ = 0x3f000000;
                auVar334._20_4_ = 0x3f000000;
                auVar334._24_4_ = 0x3f000000;
                auVar334._28_4_ = 0x3f000000;
                auVar244 = vorps_avx(auVar171,auVar334);
                auVar335._8_4_ = 0xffffff82;
                auVar335._0_8_ = 0xffffff82ffffff82;
                auVar335._12_4_ = 0xffffff82;
                auVar335._16_4_ = 0xffffff82;
                auVar335._20_4_ = 0xffffff82;
                auVar335._24_4_ = 0xffffff82;
                auVar335._28_4_ = 0xffffff82;
                auVar291 = vpaddd_avx2(auVar292,auVar335);
                auVar121._8_4_ = 0x3f3504f3;
                auVar121._0_8_ = 0x3f3504f33f3504f3;
                auVar121._12_4_ = 0x3f3504f3;
                auVar121._16_4_ = 0x3f3504f3;
                auVar121._20_4_ = 0x3f3504f3;
                auVar121._24_4_ = 0x3f3504f3;
                auVar121._28_4_ = 0x3f3504f3;
                auVar292 = vcmpps_avx(auVar244,auVar121,1);
                auVar171 = vandps_avx(auVar292,auVar244);
                auVar425._8_4_ = 0xbf800000;
                auVar425._0_8_ = 0xbf800000bf800000;
                auVar425._12_4_ = 0xbf800000;
                auVar425._16_4_ = 0xbf800000;
                auVar425._20_4_ = 0xbf800000;
                auVar425._24_4_ = 0xbf800000;
                auVar425._28_4_ = 0xbf800000;
                auVar260._0_4_ = auVar244._0_4_ + -1.0 + auVar171._0_4_;
                auVar260._4_4_ = auVar244._4_4_ + -1.0 + auVar171._4_4_;
                auVar260._8_4_ = auVar244._8_4_ + -1.0 + auVar171._8_4_;
                auVar260._12_4_ = auVar244._12_4_ + -1.0 + auVar171._12_4_;
                auVar260._16_4_ = auVar244._16_4_ + -1.0 + auVar171._16_4_;
                auVar260._20_4_ = auVar244._20_4_ + -1.0 + auVar171._20_4_;
                auVar260._24_4_ = auVar244._24_4_ + -1.0 + auVar171._24_4_;
                auVar260._28_4_ = auVar244._28_4_ + -1.0 + auVar171._28_4_;
                auVar244 = vcmpps_avx(ZEXT1632(auVar141),ZEXT1632(auVar210),2);
                auVar291 = vcvtdq2ps_avx(auVar291);
                auVar171 = vandps_avx(auVar437,auVar292);
                auVar171 = vsubps_avx(auVar291,auVar171);
                auVar336._8_4_ = 0x3d9021bb;
                auVar336._0_8_ = 0x3d9021bb3d9021bb;
                auVar336._12_4_ = 0x3d9021bb;
                auVar336._16_4_ = 0x3d9021bb;
                auVar336._20_4_ = 0x3d9021bb;
                auVar336._24_4_ = 0x3d9021bb;
                auVar336._28_4_ = 0x3d9021bb;
                auVar122._8_4_ = 0xbdebd1b8;
                auVar122._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar122._12_4_ = 0xbdebd1b8;
                auVar122._16_4_ = 0xbdebd1b8;
                auVar122._20_4_ = 0xbdebd1b8;
                auVar122._24_4_ = 0xbdebd1b8;
                auVar122._28_4_ = 0xbdebd1b8;
                auVar210 = vfmadd213ps_fma(auVar336,auVar260,auVar122);
                auVar123._8_4_ = 0x3def251a;
                auVar123._0_8_ = 0x3def251a3def251a;
                auVar123._12_4_ = 0x3def251a;
                auVar123._16_4_ = 0x3def251a;
                auVar123._20_4_ = 0x3def251a;
                auVar123._24_4_ = 0x3def251a;
                auVar123._28_4_ = 0x3def251a;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar260,auVar123);
                auVar124._8_4_ = 0xbdfe5d4f;
                auVar124._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar124._12_4_ = 0xbdfe5d4f;
                auVar124._16_4_ = 0xbdfe5d4f;
                auVar124._20_4_ = 0xbdfe5d4f;
                auVar124._24_4_ = 0xbdfe5d4f;
                auVar124._28_4_ = 0xbdfe5d4f;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar260,auVar124);
                auVar125._8_4_ = 0x3e11e9bf;
                auVar125._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar125._12_4_ = 0x3e11e9bf;
                auVar125._16_4_ = 0x3e11e9bf;
                auVar125._20_4_ = 0x3e11e9bf;
                auVar125._24_4_ = 0x3e11e9bf;
                auVar125._28_4_ = 0x3e11e9bf;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar260,auVar125);
                auVar126._8_4_ = 0xbe2aae50;
                auVar126._0_8_ = 0xbe2aae50be2aae50;
                auVar126._12_4_ = 0xbe2aae50;
                auVar126._16_4_ = 0xbe2aae50;
                auVar126._20_4_ = 0xbe2aae50;
                auVar126._24_4_ = 0xbe2aae50;
                auVar126._28_4_ = 0xbe2aae50;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar260,auVar126);
                auVar127._8_4_ = 0x3e4cceac;
                auVar127._0_8_ = 0x3e4cceac3e4cceac;
                auVar127._12_4_ = 0x3e4cceac;
                auVar127._16_4_ = 0x3e4cceac;
                auVar127._20_4_ = 0x3e4cceac;
                auVar127._24_4_ = 0x3e4cceac;
                auVar127._28_4_ = 0x3e4cceac;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar260,auVar127);
                auVar128._8_4_ = 0xbe7ffffc;
                auVar128._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar128._12_4_ = 0xbe7ffffc;
                auVar128._16_4_ = 0xbe7ffffc;
                auVar128._20_4_ = 0xbe7ffffc;
                auVar128._24_4_ = 0xbe7ffffc;
                auVar128._28_4_ = 0xbe7ffffc;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar260,auVar128);
                auVar129._8_4_ = 0x3eaaaaaa;
                auVar129._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar129._12_4_ = 0x3eaaaaaa;
                auVar129._16_4_ = 0x3eaaaaaa;
                auVar129._20_4_ = 0x3eaaaaaa;
                auVar129._24_4_ = 0x3eaaaaaa;
                auVar129._28_4_ = 0x3eaaaaaa;
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar260,auVar129);
                auVar141 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar260,auVar431);
                auVar210 = vfmadd213ps_fma(auVar171,auVar419,auVar260);
                auVar24._4_4_ = auVar260._4_4_ * auVar260._4_4_;
                auVar24._0_4_ = auVar260._0_4_ * auVar260._0_4_;
                auVar24._8_4_ = auVar260._8_4_ * auVar260._8_4_;
                auVar24._12_4_ = auVar260._12_4_ * auVar260._12_4_;
                auVar24._16_4_ = auVar260._16_4_ * auVar260._16_4_;
                auVar24._20_4_ = auVar260._20_4_ * auVar260._20_4_;
                auVar24._24_4_ = auVar260._24_4_ * auVar260._24_4_;
                auVar24._28_4_ = auVar260._28_4_;
                auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar24,ZEXT1632(auVar141));
                auVar372._8_4_ = 0xc0000000;
                auVar372._0_8_ = 0xc0000000c0000000;
                auVar372._12_4_ = 0xc0000000;
                auVar372._16_4_ = 0xc0000000;
                auVar372._20_4_ = 0xc0000000;
                auVar372._24_4_ = 0xc0000000;
                auVar372._28_4_ = 0xc0000000;
                auVar25._4_4_ = auVar210._4_4_ * -2.0;
                auVar25._0_4_ = auVar210._0_4_ * -2.0;
                auVar25._8_4_ = auVar210._8_4_ * -2.0;
                auVar25._12_4_ = auVar210._12_4_ * -2.0;
                auVar25._16_4_ = 0x80000000;
                auVar25._20_4_ = 0x80000000;
                auVar25._24_4_ = 0x80000000;
                auVar25._28_4_ = auVar260._28_4_;
                auVar130._8_4_ = 0x7fffffff;
                auVar130._0_8_ = 0x7fffffff7fffffff;
                auVar130._12_4_ = 0x7fffffff;
                auVar130._16_4_ = 0x7fffffff;
                auVar130._20_4_ = 0x7fffffff;
                auVar130._24_4_ = 0x7fffffff;
                auVar130._28_4_ = 0x7fffffff;
                auVar171 = vblendvps_avx(auVar25,auVar130,auVar244);
                auVar131._8_4_ = 0x42b0c0a5;
                auVar131._0_8_ = 0x42b0c0a542b0c0a5;
                auVar131._12_4_ = 0x42b0c0a5;
                auVar131._16_4_ = 0x42b0c0a5;
                auVar131._20_4_ = 0x42b0c0a5;
                auVar131._24_4_ = 0x42b0c0a5;
                auVar131._28_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar131);
                auVar132._8_4_ = 0xc2b0c0a5;
                auVar132._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar132._12_4_ = 0xc2b0c0a5;
                auVar132._16_4_ = 0xc2b0c0a5;
                auVar132._20_4_ = 0xc2b0c0a5;
                auVar132._24_4_ = 0xc2b0c0a5;
                auVar132._28_4_ = 0xc2b0c0a5;
                auVar292 = vmaxps_avx(auVar171,auVar132);
                auVar261._8_4_ = 0x3fb8aa3b;
                auVar261._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar261._12_4_ = 0x3fb8aa3b;
                auVar261._16_4_ = 0x3fb8aa3b;
                auVar261._20_4_ = 0x3fb8aa3b;
                auVar261._24_4_ = 0x3fb8aa3b;
                auVar261._28_4_ = 0x3fb8aa3b;
                auVar210 = vfmadd213ps_fma(auVar261,auVar292,auVar431);
                auVar244 = vroundps_avx(ZEXT1632(auVar210),1);
                auVar171 = vcmpps_avx(ZEXT1632(auVar210),auVar244,1);
                auVar171 = vandps_avx(auVar437,auVar171);
                auVar171 = vsubps_avx(auVar244,auVar171);
                auVar141 = vfnmadd231ps_fma(auVar292,auVar171,auVar419);
                auVar292 = ZEXT1632(auVar141);
                fVar8 = auVar141._0_4_;
                fVar9 = auVar141._4_4_;
                fVar10 = auVar141._8_4_;
                fVar12 = auVar141._12_4_;
                auVar26._28_4_ = auVar244._28_4_;
                auVar26._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar10 * fVar10,
                                                 CONCAT44(fVar9 * fVar9,fVar8 * fVar8))));
                auVar210 = vfmadd213ps_fma(auVar443,auVar292,auVar449);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar455);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),auVar292,auVar461);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar467);
                auVar210 = vfmadd213ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar141),auVar431);
                auVar191._0_4_ = fVar8 + 1.0;
                auVar191._4_4_ = fVar9 + 1.0;
                auVar191._8_4_ = fVar10 + 1.0;
                auVar191._12_4_ = fVar12 + 1.0;
                auVar191._16_4_ = 0x3f800000;
                auVar191._20_4_ = 0x3f800000;
                auVar191._24_4_ = 0x3f800000;
                auVar191._28_4_ = 0x3f800000;
                auVar210 = vfmadd231ps_fma(auVar191,auVar26,ZEXT1632(auVar210));
                auVar262._0_4_ = (int)auVar171._0_4_;
                auVar262._4_4_ = (int)auVar171._4_4_;
                auVar262._8_4_ = (int)auVar171._8_4_;
                auVar262._12_4_ = (int)auVar171._12_4_;
                auVar262._16_4_ = (int)auVar171._16_4_;
                auVar262._20_4_ = (int)auVar171._20_4_;
                auVar262._24_4_ = (int)auVar171._24_4_;
                auVar262._28_4_ = (int)auVar171._28_4_;
                auVar171 = vpslld_avx2(auVar262,0x17);
                auVar171 = vpaddd_avx2(auVar171,auVar401);
                auVar210 = vfmadd213ps_fma(auVar171,ZEXT1632(auVar210),auVar437);
                auVar171 = vrcpps_avx(ZEXT1632(auVar210));
                auVar210 = vfmsub213ps_fma(ZEXT1632(auVar210),auVar171,auVar437);
                auVar210 = vfnmadd132ps_fma(ZEXT1632(auVar210),auVar171,auVar171);
                auVar210 = vfnmadd213ps_fma(ZEXT1632(auVar210),auVar372,auVar425);
                auVar133._0_4_ = auVar210._0_4_ * local_158._0_4_;
                auVar133._4_4_ = auVar210._4_4_ * local_158._4_4_;
                auVar133._8_4_ = auVar210._8_4_ * fVar49;
                auVar133._12_4_ = auVar210._12_4_ * fVar48;
                auVar133._16_4_ = fVar11 * 0.0;
                auVar133._20_4_ = fVar265 * 0.0;
                auVar133._24_4_ = fVar264 * 0.0;
                auVar133._28_4_ = 0;
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar137._4_4_ = uVar1;
                auVar137._0_4_ = uVar1;
                auVar137._8_4_ = uVar1;
                auVar137._12_4_ = uVar1;
                auVar137._16_4_ = uVar1;
                auVar137._20_4_ = uVar1;
                auVar137._24_4_ = uVar1;
                auVar137._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar197._4_4_ = uVar1;
                auVar197._0_4_ = uVar1;
                auVar197._8_4_ = uVar1;
                auVar197._12_4_ = uVar1;
                auVar197._16_4_ = uVar1;
                auVar197._20_4_ = uVar1;
                auVar197._24_4_ = uVar1;
                auVar197._28_4_ = uVar1;
                auVar141 = vfmadd231ps_fma(auVar197,local_158,auVar137);
                auVar171 = vmaxps_avx(ZEXT1632(auVar141),ZEXT1632(auVar210));
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = 0x3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar171 = vminps_avx(auVar171,auVar198);
                auVar133._4_4_ = auVar171._4_4_ * local_158._4_4_;
                auVar133._0_4_ = auVar171._0_4_ * local_158._0_4_;
                auVar133._8_4_ = auVar171._8_4_ * fVar49;
                auVar133._12_4_ = auVar171._12_4_ * fVar48;
                auVar133._16_4_ = auVar171._16_4_ * fVar11;
                auVar133._20_4_ = auVar171._20_4_ * fVar265;
                auVar133._24_4_ = auVar171._24_4_ * fVar264;
                auVar133._28_4_ = auVar171._28_4_;
              }
            }
            *pauVar32 = auVar133;
            pauVar32 = pauVar32 + 1;
          }
        }
      }
      lVar30 = (long)iVar31;
      if ((iVar2 == 8) && (_elempack == 1)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        uVar35 = 0;
        if (0 < iVar44) {
          uVar35 = uVar29;
        }
        for (uVar34 = 0; uVar34 != uVar35; uVar34 = uVar34 + 1) {
          iVar37 = top_blob->w;
          sVar5 = top_blob->elemsize;
          pvVar6 = top_blob->data;
          for (lVar46 = 0; auVar171 = local_158, lVar46 <= lVar30; lVar46 = lVar46 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              fVar49 = 0.0;
            }
            else {
              fVar49 = *(float *)(*(long *)(&this->field_0x190 +
                                           (long)this->_vptr_Convolution1D_x86_avx2[-3]) +
                                 uVar34 * 4);
            }
            local_158._0_4_ = fVar49;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar34);
            pauVar32 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
            for (uVar39 = 0; uVar39 != uVar45; uVar39 = uVar39 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              pauVar38 = (undefined1 (*) [32])
                         ((long)bottom_blob_bordered.data +
                         (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)lVar46 * 8) * 4 +
                         (long)bottom_blob_bordered.w *
                         CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                  (undefined4)bottom_blob_bordered.elemsize) * uVar39);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar42 = 0;
              }
              while (bVar47 = iVar42 != 0, iVar42 = iVar42 + -1, bVar47) {
                auVar210 = vfmadd231ps_fma(auVar138._0_32_,*pauVar32,*pauVar38);
                auVar138 = ZEXT1664(auVar210);
                pauVar38 = pauVar38 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                pauVar32 = pauVar32 + 1;
              }
            }
            auVar141._0_4_ = auVar138._16_4_ + auVar138._0_4_;
            auVar141._4_4_ = auVar138._20_4_ + auVar138._4_4_;
            auVar141._8_4_ = auVar138._24_4_ + auVar138._8_4_;
            auVar141._12_4_ = auVar138._28_4_ + auVar138._12_4_;
            auVar210 = vshufpd_avx(auVar141,auVar141,1);
            auVar300._0_4_ = auVar210._0_4_ + auVar141._0_4_;
            auVar300._4_4_ = auVar210._4_4_ + auVar141._4_4_;
            auVar300._8_4_ = auVar210._8_4_ + auVar141._8_4_;
            auVar300._12_4_ = auVar210._12_4_ + auVar141._12_4_;
            auVar210 = vmovshdup_avx(auVar300);
            fVar49 = auVar210._0_4_ + auVar300._0_4_ + fVar49;
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar210 = ZEXT416((uint)fVar49);
            fVar48 = fVar49;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar210 = vmaxss_avx(auVar210,ZEXT416(0));
              fVar48 = auVar210._0_4_;
              break;
            case 2:
              auVar50._0_12_ = ZEXT812(0);
              auVar50._12_4_ = 0;
              auVar210 = vcmpss_avx(auVar50,auVar210,1);
              auVar199._8_4_ = 0x3f800000;
              auVar199._0_8_ = 0x3f8000003f800000;
              auVar199._12_4_ = 0x3f800000;
              auVar210 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar199,auVar210);
              fVar48 = auVar210._0_4_ * fVar49;
              break;
            case 3:
              auVar210 = vmaxss_avx(auVar210,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              auVar210 = vminss_avx(auVar210,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4))
                                                     [1]));
              fVar48 = auVar210._0_4_;
              break;
            case 4:
              fVar49 = expf(-fVar49);
              fVar48 = 1.0 / (fVar49 + 1.0);
              break;
            case 5:
              local_158._16_16_ = auVar171._16_16_;
              local_158._0_16_ = auVar210;
              fVar48 = expf(fVar49);
              fVar48 = logf(fVar48 + 1.0);
              fVar48 = tanhf(fVar48);
              fVar48 = fVar48 * fVar49;
              break;
            case 6:
              fVar11 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar265 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar264 = -fVar265 / fVar11;
              fVar48 = 0.0;
              if ((fVar264 <= fVar49) && (fVar48 = fVar49, fVar49 <= fVar264 + 1.0 / fVar11)) {
                auVar210 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar210,ZEXT416((uint)fVar265));
                fVar48 = auVar210._0_4_ * fVar49;
              }
            }
            *(float *)((long)pvVar6 + lVar46 * 4 + (long)iVar37 * uVar34 * sVar5) = fVar48;
          }
        }
      }
      if ((iVar2 == 8) && (_elempack == 4)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        uVar35 = 0;
        if (0 < iVar44) {
          uVar35 = uVar29;
        }
        for (uVar34 = 0; uVar34 != uVar35; uVar34 = uVar34 + 1) {
          pauVar33 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar34 * top_blob->elemsize + (long)top_blob->data);
          for (iVar37 = 0; iVar37 <= iVar31; iVar37 = iVar37 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              auVar210 = ZEXT816(0) << 0x40;
            }
            else {
              auVar210 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 +
                                    (long)this->_vptr_Convolution1D_x86_avx2[-3]) + uVar34 * 0x10);
            }
            local_158._0_16_ = auVar210;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar34);
            pauVar32 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            for (uVar39 = 0; uVar39 != uVar45; uVar39 = uVar39 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              puVar40 = (undefined4 *)
                        ((long)bottom_blob_bordered.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar37 * 8) * 4 +
                        (long)bottom_blob_bordered.w *
                        CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                 (undefined4)bottom_blob_bordered.elemsize) * uVar39);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar42 = 0;
              }
              while (bVar47 = iVar42 != 0, iVar42 = iVar42 + -1, bVar47) {
                uVar1 = *puVar40;
                auVar210._4_4_ = uVar1;
                auVar210._0_4_ = uVar1;
                auVar210._8_4_ = uVar1;
                auVar210._12_4_ = uVar1;
                uVar1 = puVar40[1];
                auVar139._4_4_ = uVar1;
                auVar139._0_4_ = uVar1;
                auVar139._8_4_ = uVar1;
                auVar139._12_4_ = uVar1;
                uVar1 = puVar40[2];
                auVar200._4_4_ = uVar1;
                auVar200._0_4_ = uVar1;
                auVar200._8_4_ = uVar1;
                auVar200._12_4_ = uVar1;
                uVar1 = puVar40[3];
                auVar266._4_4_ = uVar1;
                auVar266._0_4_ = uVar1;
                auVar266._8_4_ = uVar1;
                auVar266._12_4_ = uVar1;
                uVar1 = puVar40[4];
                auVar297._4_4_ = uVar1;
                auVar297._0_4_ = uVar1;
                auVar297._8_4_ = uVar1;
                auVar297._12_4_ = uVar1;
                uVar1 = puVar40[5];
                auVar339._4_4_ = uVar1;
                auVar339._0_4_ = uVar1;
                auVar339._8_4_ = uVar1;
                auVar339._12_4_ = uVar1;
                uVar1 = puVar40[6];
                auVar374._4_4_ = uVar1;
                auVar374._0_4_ = uVar1;
                auVar374._8_4_ = uVar1;
                auVar374._12_4_ = uVar1;
                uVar1 = puVar40[7];
                auVar406._4_4_ = uVar1;
                auVar406._0_4_ = uVar1;
                auVar406._8_4_ = uVar1;
                auVar406._12_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(local_158._0_16_,auVar210,*(undefined1 (*) [16])*pauVar32
                                          );
                auVar210 = vfmadd231ps_fma(auVar210,auVar139,
                                           *(undefined1 (*) [16])(*pauVar32 + 0x10));
                auVar210 = vfmadd231ps_fma(auVar210,auVar200,*(undefined1 (*) [16])pauVar32[1]);
                auVar210 = vfmadd231ps_fma(auVar210,auVar266,
                                           *(undefined1 (*) [16])(pauVar32[1] + 0x10));
                auVar210 = vfmadd231ps_fma(auVar210,auVar297,*(undefined1 (*) [16])pauVar32[2]);
                auVar210 = vfmadd231ps_fma(auVar210,auVar339,
                                           *(undefined1 (*) [16])(pauVar32[2] + 0x10));
                auVar210 = vfmadd231ps_fma(auVar210,auVar374,*(undefined1 (*) [16])pauVar32[3]);
                auVar210 = vfmadd231ps_fma(auVar210,auVar406,
                                           *(undefined1 (*) [16])(pauVar32[3] + 0x10));
                local_158._0_16_ = auVar210;
                puVar40 = puVar40 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 8;
                pauVar32 = pauVar32 + 4;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar59 = local_158._0_16_;
            if (*(int *)(&this->field_0xf4 + (long)p_Var4) - 1U < 6) {
              auVar210 = ZEXT816(0) << 0x40;
              auVar59 = vmaxps_avx(local_158._0_16_,auVar210);
              switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
              case 2:
                auVar210 = vminps_avx(local_158._0_16_,auVar210);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar201._4_4_ = uVar1;
                auVar201._0_4_ = uVar1;
                auVar201._8_4_ = uVar1;
                auVar201._12_4_ = uVar1;
                auVar59 = vfmadd231ps_fma(auVar59,auVar210,auVar201);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar55._4_4_ = uVar1;
                auVar55._0_4_ = uVar1;
                auVar55._8_4_ = uVar1;
                auVar55._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar143._4_4_ = uVar1;
                auVar143._0_4_ = uVar1;
                auVar143._8_4_ = uVar1;
                auVar143._12_4_ = uVar1;
                auVar210 = vmaxps_avx(local_158._0_16_,auVar55);
                auVar59 = vminps_avx(auVar210,auVar143);
                break;
              case 4:
                auVar56._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
                auVar56._8_4_ = -local_158._8_4_;
                auVar56._12_4_ = -local_158._12_4_;
                auVar144._8_4_ = 0x42b0c0a5;
                auVar144._0_8_ = 0x42b0c0a542b0c0a5;
                auVar144._12_4_ = 0x42b0c0a5;
                auVar210 = vminps_avx(auVar56,auVar144);
                auVar145._8_4_ = 0xc2b0c0a5;
                auVar145._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar145._12_4_ = 0xc2b0c0a5;
                auVar300 = vmaxps_avx(auVar210,auVar145);
                auVar146._8_4_ = 0x3fb8aa3b;
                auVar146._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar146._12_4_ = 0x3fb8aa3b;
                auVar303._8_4_ = 0x3f000000;
                auVar303._0_8_ = 0x3f0000003f000000;
                auVar303._12_4_ = 0x3f000000;
                auVar210 = vfmadd213ps_fma(auVar146,auVar300,auVar303);
                auVar212._0_4_ = (int)auVar210._0_4_;
                auVar212._4_4_ = (int)auVar210._4_4_;
                auVar212._8_4_ = (int)auVar210._8_4_;
                auVar212._12_4_ = (int)auVar210._12_4_;
                auVar141 = vcvtdq2ps_avx(auVar212);
                auVar210 = vcmpps_avx(auVar210,auVar141,1);
                auVar348._8_4_ = 0x3f800000;
                auVar348._0_8_ = 0x3f8000003f800000;
                auVar348._12_4_ = 0x3f800000;
                auVar210 = vandps_avx(auVar210,auVar348);
                auVar210 = vsubps_avx(auVar141,auVar210);
                auVar213._8_4_ = 0xbf317218;
                auVar213._0_8_ = 0xbf317218bf317218;
                auVar213._12_4_ = 0xbf317218;
                auVar300 = vfmadd231ps_fma(auVar300,auVar210,auVar213);
                fVar49 = auVar300._0_4_;
                auVar214._0_4_ = fVar49 * fVar49;
                fVar48 = auVar300._4_4_;
                auVar214._4_4_ = fVar48 * fVar48;
                fVar11 = auVar300._8_4_;
                auVar214._8_4_ = fVar11 * fVar11;
                fVar265 = auVar300._12_4_;
                auVar214._12_4_ = fVar265 * fVar265;
                auVar274._8_4_ = 0x39506967;
                auVar274._0_8_ = 0x3950696739506967;
                auVar274._12_4_ = 0x39506967;
                auVar375._8_4_ = 0x3ab743ce;
                auVar375._0_8_ = 0x3ab743ce3ab743ce;
                auVar375._12_4_ = 0x3ab743ce;
                auVar141 = vfmadd213ps_fma(auVar274,auVar300,auVar375);
                auVar376._8_4_ = 0x3c088908;
                auVar376._0_8_ = 0x3c0889083c088908;
                auVar376._12_4_ = 0x3c088908;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar376);
                auVar377._8_4_ = 0x3d2aa9c1;
                auVar377._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar377._12_4_ = 0x3d2aa9c1;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar377);
                auVar378._8_4_ = 0x3e2aaaaa;
                auVar378._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar378._12_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar378);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar303);
                auVar304._0_4_ = fVar49 + 1.0;
                auVar304._4_4_ = fVar48 + 1.0;
                auVar304._8_4_ = fVar11 + 1.0;
                auVar304._12_4_ = fVar265 + 1.0;
                auVar141 = vfmadd231ps_fma(auVar304,auVar214,auVar141);
                auVar57._0_4_ = (int)auVar210._0_4_;
                auVar57._4_4_ = (int)auVar210._4_4_;
                auVar57._8_4_ = (int)auVar210._8_4_;
                auVar57._12_4_ = (int)auVar210._12_4_;
                auVar210 = vpslld_avx(auVar57,0x17);
                auVar147._8_4_ = 0x3f800000;
                auVar147._0_8_ = 0x3f8000003f800000;
                auVar147._12_4_ = 0x3f800000;
                auVar210 = vpaddd_avx(auVar210,auVar147);
                auVar141 = vfmadd213ps_fma(auVar210,auVar141,auVar348);
                auVar210 = vrcpps_avx(auVar141);
                auVar141 = vfmsub213ps_fma(auVar141,auVar210,auVar348);
                auVar59 = vfnmadd132ps_fma(auVar141,auVar210,auVar210);
                break;
              case 5:
                auVar407._8_4_ = 0x42b0c0a5;
                auVar407._0_8_ = 0x42b0c0a542b0c0a5;
                auVar407._12_4_ = 0x42b0c0a5;
                auVar141 = vminps_avx(local_158._0_16_,auVar407);
                auVar420._8_4_ = 0xc2b0c0a5;
                auVar420._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar420._12_4_ = 0xc2b0c0a5;
                auVar50 = vmaxps_avx(auVar420,auVar141);
                auVar140._8_4_ = 0x3fb8aa3b;
                auVar140._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar140._12_4_ = 0x3fb8aa3b;
                auVar432._8_4_ = 0x3f000000;
                auVar432._0_8_ = 0x3f0000003f000000;
                auVar432._12_4_ = 0x3f000000;
                auVar141 = vfmadd213ps_fma(auVar140,auVar50,auVar432);
                auVar202._0_4_ = (int)auVar141._0_4_;
                auVar202._4_4_ = (int)auVar141._4_4_;
                auVar202._8_4_ = (int)auVar141._8_4_;
                auVar202._12_4_ = (int)auVar141._12_4_;
                auVar300 = vcvtdq2ps_avx(auVar202);
                auVar141 = vcmpps_avx(auVar141,auVar300,1);
                auVar438._8_4_ = 0x3f800000;
                auVar438._0_8_ = 0x3f8000003f800000;
                auVar438._12_4_ = 0x3f800000;
                auVar141 = vandps_avx(auVar438,auVar141);
                auVar141 = vsubps_avx(auVar300,auVar141);
                auVar426._8_4_ = 0x3f317218;
                auVar426._0_8_ = 0x3f3172183f317218;
                auVar426._12_4_ = 0x3f317218;
                auVar50 = vfnmadd231ps_fma(auVar50,auVar141,auVar426);
                fVar49 = auVar50._0_4_;
                auVar203._0_4_ = fVar49 * fVar49;
                fVar48 = auVar50._4_4_;
                auVar203._4_4_ = fVar48 * fVar48;
                fVar11 = auVar50._8_4_;
                auVar203._8_4_ = fVar11 * fVar11;
                fVar265 = auVar50._12_4_;
                auVar203._12_4_ = fVar265 * fVar265;
                auVar444._8_4_ = 0x39506967;
                auVar444._0_8_ = 0x3950696739506967;
                auVar444._12_4_ = 0x39506967;
                auVar450._8_4_ = 0x3ab743ce;
                auVar450._0_8_ = 0x3ab743ce3ab743ce;
                auVar450._12_4_ = 0x3ab743ce;
                auVar300 = vfmadd213ps_fma(auVar444,auVar50,auVar450);
                auVar456._8_4_ = 0x3c088908;
                auVar456._0_8_ = 0x3c0889083c088908;
                auVar456._12_4_ = 0x3c088908;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar456);
                auVar462._8_4_ = 0x3d2aa9c1;
                auVar462._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar462._12_4_ = 0x3d2aa9c1;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar462);
                auVar298._8_4_ = 0x3e2aaaaa;
                auVar298._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar298._12_4_ = 0x3e2aaaaa;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar298);
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar432);
                auVar299._0_4_ = fVar49 + 1.0;
                auVar299._4_4_ = fVar48 + 1.0;
                auVar299._8_4_ = fVar11 + 1.0;
                auVar299._12_4_ = fVar265 + 1.0;
                auVar300 = vfmadd231ps_fma(auVar299,auVar203,auVar300);
                auVar51._0_4_ = (int)auVar141._0_4_;
                auVar51._4_4_ = (int)auVar141._4_4_;
                auVar51._8_4_ = (int)auVar141._8_4_;
                auVar51._12_4_ = (int)auVar141._12_4_;
                auVar141 = vpslld_avx(auVar51,0x17);
                auVar408._8_4_ = 0x3f800000;
                auVar408._0_8_ = 0x3f8000003f800000;
                auVar408._12_4_ = 0x3f800000;
                auVar141 = vpaddd_avx(auVar141,auVar408);
                auVar139 = vfmadd213ps_fma(auVar141,auVar300,auVar438);
                auVar204._8_4_ = 0x800000;
                auVar204._0_8_ = 0x80000000800000;
                auVar204._12_4_ = 0x800000;
                auVar141 = vmaxps_avx(auVar139,auVar204);
                auVar267._8_4_ = 0x807fffff;
                auVar267._0_8_ = 0x807fffff807fffff;
                auVar267._12_4_ = 0x807fffff;
                auVar300 = vpsrld_avx(auVar141,0x17);
                auVar141 = vandps_avx(auVar141,auVar267);
                auVar268._8_4_ = 0x3f000000;
                auVar268._0_8_ = 0x3f0000003f000000;
                auVar268._12_4_ = 0x3f000000;
                auVar50 = vorps_avx(auVar141,auVar268);
                auVar269._8_4_ = 0xffffff82;
                auVar269._0_8_ = 0xffffff82ffffff82;
                auVar269._12_4_ = 0xffffff82;
                auVar199 = vpaddd_avx(auVar300,auVar269);
                auVar301._8_4_ = 0x3f3504f3;
                auVar301._0_8_ = 0x3f3504f33f3504f3;
                auVar301._12_4_ = 0x3f3504f3;
                auVar300 = vcmpps_avx(auVar50,auVar301,1);
                auVar141 = vandps_avx(auVar300,auVar50);
                auVar205._0_4_ = auVar50._0_4_ + -1.0 + auVar141._0_4_;
                auVar205._4_4_ = auVar50._4_4_ + -1.0 + auVar141._4_4_;
                auVar205._8_4_ = auVar50._8_4_ + -1.0 + auVar141._8_4_;
                auVar205._12_4_ = auVar50._12_4_ + -1.0 + auVar141._12_4_;
                auVar141 = vcmpps_avx(auVar139,auVar210,2);
                auVar50 = vcvtdq2ps_avx(auVar199);
                auVar210 = vandps_avx(auVar438,auVar300);
                auVar210 = vsubps_avx(auVar50,auVar210);
                auVar302._8_4_ = 0x3d9021bb;
                auVar302._0_8_ = 0x3d9021bb3d9021bb;
                auVar302._12_4_ = 0x3d9021bb;
                auVar340._8_4_ = 0xbdebd1b8;
                auVar340._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar340._12_4_ = 0xbdebd1b8;
                auVar300 = vfmadd213ps_fma(auVar302,auVar205,auVar340);
                auVar341._8_4_ = 0x3def251a;
                auVar341._0_8_ = 0x3def251a3def251a;
                auVar341._12_4_ = 0x3def251a;
                auVar300 = vfmadd213ps_fma(auVar300,auVar205,auVar341);
                auVar342._8_4_ = 0xbdfe5d4f;
                auVar342._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar342._12_4_ = 0xbdfe5d4f;
                auVar300 = vfmadd213ps_fma(auVar300,auVar205,auVar342);
                auVar343._8_4_ = 0x3e11e9bf;
                auVar343._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar343._12_4_ = 0x3e11e9bf;
                auVar300 = vfmadd213ps_fma(auVar300,auVar205,auVar343);
                auVar344._8_4_ = 0xbe2aae50;
                auVar344._0_8_ = 0xbe2aae50be2aae50;
                auVar344._12_4_ = 0xbe2aae50;
                auVar300 = vfmadd213ps_fma(auVar300,auVar205,auVar344);
                auVar345._8_4_ = 0x3e4cceac;
                auVar345._0_8_ = 0x3e4cceac3e4cceac;
                auVar345._12_4_ = 0x3e4cceac;
                auVar300 = vfmadd213ps_fma(auVar300,auVar205,auVar345);
                auVar346._8_4_ = 0xbe7ffffc;
                auVar346._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar346._12_4_ = 0xbe7ffffc;
                auVar300 = vfmadd213ps_fma(auVar300,auVar205,auVar346);
                auVar347._8_4_ = 0x3eaaaaaa;
                auVar347._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar347._12_4_ = 0x3eaaaaaa;
                auVar300 = vfmadd213ps_fma(auVar300,auVar205,auVar347);
                auVar300 = vfmsub213ps_fma(auVar300,auVar205,auVar432);
                auVar210 = vfmadd213ps_fma(auVar210,auVar426,auVar205);
                auVar206._0_4_ = auVar205._0_4_ * auVar205._0_4_;
                auVar206._4_4_ = auVar205._4_4_ * auVar205._4_4_;
                auVar206._8_4_ = auVar205._8_4_ * auVar205._8_4_;
                auVar206._12_4_ = auVar205._12_4_ * auVar205._12_4_;
                auVar210 = vfmadd231ps_fma(auVar210,auVar206,auVar300);
                auVar207._0_4_ = auVar210._0_4_ * -2.0;
                auVar207._4_4_ = auVar210._4_4_ * -2.0;
                auVar207._8_4_ = auVar210._8_4_ * -2.0;
                auVar207._12_4_ = auVar210._12_4_ * -2.0;
                auVar270._8_4_ = 0x7fffffff;
                auVar270._0_8_ = 0x7fffffff7fffffff;
                auVar270._12_4_ = 0x7fffffff;
                auVar210 = vblendvps_avx(auVar207,auVar270,auVar141);
                auVar52._8_4_ = 0x42b0c0a5;
                auVar52._0_8_ = 0x42b0c0a542b0c0a5;
                auVar52._12_4_ = 0x42b0c0a5;
                auVar210 = vminps_avx(auVar210,auVar52);
                auVar53._8_4_ = 0xc2b0c0a5;
                auVar53._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar53._12_4_ = 0xc2b0c0a5;
                auVar300 = vmaxps_avx(auVar210,auVar53);
                auVar208._8_4_ = 0x3fb8aa3b;
                auVar208._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar208._12_4_ = 0x3fb8aa3b;
                auVar210 = vfmadd213ps_fma(auVar208,auVar300,auVar432);
                auVar271._0_4_ = (int)auVar210._0_4_;
                auVar271._4_4_ = (int)auVar210._4_4_;
                auVar271._8_4_ = (int)auVar210._8_4_;
                auVar271._12_4_ = (int)auVar210._12_4_;
                auVar141 = vcvtdq2ps_avx(auVar271);
                auVar210 = vcmpps_avx(auVar210,auVar141,1);
                auVar210 = vandps_avx(auVar438,auVar210);
                auVar210 = vsubps_avx(auVar141,auVar210);
                auVar300 = vfnmadd231ps_fma(auVar300,auVar210,auVar426);
                fVar49 = auVar300._0_4_;
                auVar272._0_4_ = fVar49 * fVar49;
                fVar48 = auVar300._4_4_;
                auVar272._4_4_ = fVar48 * fVar48;
                fVar11 = auVar300._8_4_;
                auVar272._8_4_ = fVar11 * fVar11;
                fVar265 = auVar300._12_4_;
                auVar272._12_4_ = fVar265 * fVar265;
                auVar141 = vfmadd213ps_fma(auVar444,auVar300,auVar450);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar456);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar462);
                auVar54._8_4_ = 0x3e2aaaaa;
                auVar54._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar54._12_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar54);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar432);
                auVar142._0_4_ = fVar49 + 1.0;
                auVar142._4_4_ = fVar48 + 1.0;
                auVar142._8_4_ = fVar11 + 1.0;
                auVar142._12_4_ = fVar265 + 1.0;
                auVar141 = vfmadd231ps_fma(auVar142,auVar272,auVar141);
                auVar209._0_4_ = (int)auVar210._0_4_;
                auVar209._4_4_ = (int)auVar210._4_4_;
                auVar209._8_4_ = (int)auVar210._8_4_;
                auVar209._12_4_ = (int)auVar210._12_4_;
                auVar210 = vpslld_avx(auVar209,0x17);
                auVar210 = vpaddd_avx(auVar210,auVar408);
                auVar141 = vfmadd213ps_fma(auVar210,auVar141,auVar438);
                auVar210 = vrcpps_avx(auVar141);
                auVar211._0_4_ = auVar210._0_4_ + auVar210._0_4_;
                auVar211._4_4_ = auVar210._4_4_ + auVar210._4_4_;
                auVar211._8_4_ = auVar210._8_4_ + auVar210._8_4_;
                auVar211._12_4_ = auVar210._12_4_ + auVar210._12_4_;
                auVar273._8_4_ = 0x40000000;
                auVar273._0_8_ = 0x4000000040000000;
                auVar273._12_4_ = 0x40000000;
                auVar141 = vfmsub213ps_fma(auVar141,auVar211,auVar273);
                auVar210 = vfnmadd213ps_fma(auVar141,auVar210,auVar211);
                auVar59 = vfmsub213ps_fma(auVar210,local_158._0_16_,local_158._0_16_);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar58._4_4_ = uVar1;
                auVar58._0_4_ = uVar1;
                auVar58._8_4_ = uVar1;
                auVar58._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar148._4_4_ = uVar1;
                auVar148._0_4_ = uVar1;
                auVar148._8_4_ = uVar1;
                auVar148._12_4_ = uVar1;
                auVar141 = vfmadd231ps_fma(auVar148,local_158._0_16_,auVar58);
                auVar210 = vmaxps_avx(auVar141,auVar210);
                auVar149._8_4_ = 0x3f800000;
                auVar149._0_8_ = 0x3f8000003f800000;
                auVar149._12_4_ = 0x3f800000;
                auVar210 = vminps_avx(auVar210,auVar149);
                auVar59._0_4_ = auVar210._0_4_ * local_158._0_4_;
                auVar59._4_4_ = auVar210._4_4_ * local_158._4_4_;
                auVar59._8_4_ = auVar210._8_4_ * local_158._8_4_;
                auVar59._12_4_ = auVar210._12_4_ * local_158._12_4_;
              }
            }
            *pauVar33 = auVar59;
            pauVar33 = pauVar33 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 4)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        local_38 = 0;
        if (0 < iVar44) {
          local_38 = uVar29;
        }
        for (uVar35 = 0; uVar35 != local_38; uVar35 = uVar35 + 1) {
          pauVar33 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar35 * top_blob->elemsize + (long)top_blob->data);
          for (iVar37 = 0; iVar37 <= iVar31; iVar37 = iVar37 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              auVar210 = ZEXT816(0) << 0x40;
            }
            else {
              auVar210 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 +
                                    (long)this->_vptr_Convolution1D_x86_avx2[-3]) + uVar35 * 0x10);
            }
            local_158._0_16_ = auVar210;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar35);
            pauVar32 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            for (uVar34 = 0; uVar34 != uVar45; uVar34 = uVar34 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              puVar40 = (undefined4 *)
                        ((long)bottom_blob_bordered.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar37 * 4) * 4 +
                        (long)bottom_blob_bordered.w *
                        CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                 (undefined4)bottom_blob_bordered.elemsize) * uVar34);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar42 = 0;
              }
              while (bVar47 = iVar42 != 0, iVar42 = iVar42 + -1, bVar47) {
                uVar1 = *puVar40;
                auVar60._4_4_ = uVar1;
                auVar60._0_4_ = uVar1;
                auVar60._8_4_ = uVar1;
                auVar60._12_4_ = uVar1;
                uVar1 = puVar40[1];
                auVar150._4_4_ = uVar1;
                auVar150._0_4_ = uVar1;
                auVar150._8_4_ = uVar1;
                auVar150._12_4_ = uVar1;
                uVar1 = puVar40[2];
                auVar215._4_4_ = uVar1;
                auVar215._0_4_ = uVar1;
                auVar215._8_4_ = uVar1;
                auVar215._12_4_ = uVar1;
                auVar210 = vfmadd132ps_fma(auVar60,local_158._0_16_,*(undefined1 (*) [16])*pauVar32)
                ;
                auVar210 = vfmadd231ps_fma(auVar210,auVar150,
                                           *(undefined1 (*) [16])(*pauVar32 + 0x10));
                auVar210 = vfmadd231ps_fma(auVar210,auVar215,*(undefined1 (*) [16])pauVar32[1]);
                uVar1 = puVar40[3];
                auVar151._4_4_ = uVar1;
                auVar151._0_4_ = uVar1;
                auVar151._8_4_ = uVar1;
                auVar151._12_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(auVar210,auVar151,
                                           *(undefined1 (*) [16])(pauVar32[1] + 0x10));
                puVar40 = puVar40 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 4;
                pauVar32 = pauVar32 + 2;
                local_158._0_16_ = auVar210;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar69 = local_158._0_16_;
            if (*(int *)(&this->field_0xf4 + (long)p_Var4) - 1U < 6) {
              auVar210 = ZEXT816(0) << 0x40;
              auVar69 = vmaxps_avx(local_158._0_16_,auVar210);
              switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
              case 2:
                auVar210 = vminps_avx(local_158._0_16_,auVar210);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar216._4_4_ = uVar1;
                auVar216._0_4_ = uVar1;
                auVar216._8_4_ = uVar1;
                auVar216._12_4_ = uVar1;
                auVar69 = vfmadd231ps_fma(auVar69,auVar210,auVar216);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar65._4_4_ = uVar1;
                auVar65._0_4_ = uVar1;
                auVar65._8_4_ = uVar1;
                auVar65._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar154._4_4_ = uVar1;
                auVar154._0_4_ = uVar1;
                auVar154._8_4_ = uVar1;
                auVar154._12_4_ = uVar1;
                auVar210 = vmaxps_avx(local_158._0_16_,auVar65);
                auVar69 = vminps_avx(auVar210,auVar154);
                break;
              case 4:
                auVar66._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
                auVar66._8_4_ = -local_158._8_4_;
                auVar66._12_4_ = -local_158._12_4_;
                auVar155._8_4_ = 0x42b0c0a5;
                auVar155._0_8_ = 0x42b0c0a542b0c0a5;
                auVar155._12_4_ = 0x42b0c0a5;
                auVar210 = vminps_avx(auVar66,auVar155);
                auVar156._8_4_ = 0xc2b0c0a5;
                auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar156._12_4_ = 0xc2b0c0a5;
                auVar300 = vmaxps_avx(auVar210,auVar156);
                auVar157._8_4_ = 0x3fb8aa3b;
                auVar157._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar157._12_4_ = 0x3fb8aa3b;
                auVar309._8_4_ = 0x3f000000;
                auVar309._0_8_ = 0x3f0000003f000000;
                auVar309._12_4_ = 0x3f000000;
                auVar210 = vfmadd213ps_fma(auVar157,auVar300,auVar309);
                auVar226._0_4_ = (int)auVar210._0_4_;
                auVar226._4_4_ = (int)auVar210._4_4_;
                auVar226._8_4_ = (int)auVar210._8_4_;
                auVar226._12_4_ = (int)auVar210._12_4_;
                auVar141 = vcvtdq2ps_avx(auVar226);
                auVar210 = vcmpps_avx(auVar210,auVar141,1);
                auVar357._8_4_ = 0x3f800000;
                auVar357._0_8_ = 0x3f8000003f800000;
                auVar357._12_4_ = 0x3f800000;
                auVar210 = vandps_avx(auVar210,auVar357);
                auVar210 = vsubps_avx(auVar141,auVar210);
                auVar227._8_4_ = 0xbf317218;
                auVar227._0_8_ = 0xbf317218bf317218;
                auVar227._12_4_ = 0xbf317218;
                auVar300 = vfmadd231ps_fma(auVar300,auVar210,auVar227);
                fVar49 = auVar300._0_4_;
                auVar228._0_4_ = fVar49 * fVar49;
                fVar48 = auVar300._4_4_;
                auVar228._4_4_ = fVar48 * fVar48;
                fVar11 = auVar300._8_4_;
                auVar228._8_4_ = fVar11 * fVar11;
                fVar265 = auVar300._12_4_;
                auVar228._12_4_ = fVar265 * fVar265;
                auVar282._8_4_ = 0x39506967;
                auVar282._0_8_ = 0x3950696739506967;
                auVar282._12_4_ = 0x39506967;
                auVar379._8_4_ = 0x3ab743ce;
                auVar379._0_8_ = 0x3ab743ce3ab743ce;
                auVar379._12_4_ = 0x3ab743ce;
                auVar141 = vfmadd213ps_fma(auVar282,auVar300,auVar379);
                auVar380._8_4_ = 0x3c088908;
                auVar380._0_8_ = 0x3c0889083c088908;
                auVar380._12_4_ = 0x3c088908;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar380);
                auVar381._8_4_ = 0x3d2aa9c1;
                auVar381._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar381._12_4_ = 0x3d2aa9c1;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar381);
                auVar382._8_4_ = 0x3e2aaaaa;
                auVar382._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar382._12_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar382);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar309);
                auVar310._0_4_ = fVar49 + 1.0;
                auVar310._4_4_ = fVar48 + 1.0;
                auVar310._8_4_ = fVar11 + 1.0;
                auVar310._12_4_ = fVar265 + 1.0;
                auVar141 = vfmadd231ps_fma(auVar310,auVar228,auVar141);
                auVar67._0_4_ = (int)auVar210._0_4_;
                auVar67._4_4_ = (int)auVar210._4_4_;
                auVar67._8_4_ = (int)auVar210._8_4_;
                auVar67._12_4_ = (int)auVar210._12_4_;
                auVar210 = vpslld_avx(auVar67,0x17);
                auVar158._8_4_ = 0x3f800000;
                auVar158._0_8_ = 0x3f8000003f800000;
                auVar158._12_4_ = 0x3f800000;
                auVar210 = vpaddd_avx(auVar210,auVar158);
                auVar141 = vfmadd213ps_fma(auVar210,auVar141,auVar357);
                auVar210 = vrcpps_avx(auVar141);
                auVar141 = vfmsub213ps_fma(auVar141,auVar210,auVar357);
                auVar69 = vfnmadd132ps_fma(auVar141,auVar210,auVar210);
                break;
              case 5:
                auVar409._8_4_ = 0x42b0c0a5;
                auVar409._0_8_ = 0x42b0c0a542b0c0a5;
                auVar409._12_4_ = 0x42b0c0a5;
                auVar141 = vminps_avx(local_158._0_16_,auVar409);
                auVar421._8_4_ = 0xc2b0c0a5;
                auVar421._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar421._12_4_ = 0xc2b0c0a5;
                auVar50 = vmaxps_avx(auVar421,auVar141);
                auVar152._8_4_ = 0x3fb8aa3b;
                auVar152._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar152._12_4_ = 0x3fb8aa3b;
                auVar433._8_4_ = 0x3f000000;
                auVar433._0_8_ = 0x3f0000003f000000;
                auVar433._12_4_ = 0x3f000000;
                auVar141 = vfmadd213ps_fma(auVar152,auVar50,auVar433);
                auVar217._0_4_ = (int)auVar141._0_4_;
                auVar217._4_4_ = (int)auVar141._4_4_;
                auVar217._8_4_ = (int)auVar141._8_4_;
                auVar217._12_4_ = (int)auVar141._12_4_;
                auVar300 = vcvtdq2ps_avx(auVar217);
                auVar141 = vcmpps_avx(auVar141,auVar300,1);
                auVar439._8_4_ = 0x3f800000;
                auVar439._0_8_ = 0x3f8000003f800000;
                auVar439._12_4_ = 0x3f800000;
                auVar141 = vandps_avx(auVar439,auVar141);
                auVar141 = vsubps_avx(auVar300,auVar141);
                auVar427._8_4_ = 0x3f317218;
                auVar427._0_8_ = 0x3f3172183f317218;
                auVar427._12_4_ = 0x3f317218;
                auVar50 = vfnmadd231ps_fma(auVar50,auVar141,auVar427);
                fVar49 = auVar50._0_4_;
                auVar218._0_4_ = fVar49 * fVar49;
                fVar48 = auVar50._4_4_;
                auVar218._4_4_ = fVar48 * fVar48;
                fVar11 = auVar50._8_4_;
                auVar218._8_4_ = fVar11 * fVar11;
                fVar265 = auVar50._12_4_;
                auVar218._12_4_ = fVar265 * fVar265;
                auVar445._8_4_ = 0x39506967;
                auVar445._0_8_ = 0x3950696739506967;
                auVar445._12_4_ = 0x39506967;
                auVar451._8_4_ = 0x3ab743ce;
                auVar451._0_8_ = 0x3ab743ce3ab743ce;
                auVar451._12_4_ = 0x3ab743ce;
                auVar300 = vfmadd213ps_fma(auVar445,auVar50,auVar451);
                auVar457._8_4_ = 0x3c088908;
                auVar457._0_8_ = 0x3c0889083c088908;
                auVar457._12_4_ = 0x3c088908;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar457);
                auVar463._8_4_ = 0x3d2aa9c1;
                auVar463._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar463._12_4_ = 0x3d2aa9c1;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar463);
                auVar305._8_4_ = 0x3e2aaaaa;
                auVar305._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar305._12_4_ = 0x3e2aaaaa;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar305);
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar433);
                auVar306._0_4_ = fVar49 + 1.0;
                auVar306._4_4_ = fVar48 + 1.0;
                auVar306._8_4_ = fVar11 + 1.0;
                auVar306._12_4_ = fVar265 + 1.0;
                auVar300 = vfmadd231ps_fma(auVar306,auVar218,auVar300);
                auVar61._0_4_ = (int)auVar141._0_4_;
                auVar61._4_4_ = (int)auVar141._4_4_;
                auVar61._8_4_ = (int)auVar141._8_4_;
                auVar61._12_4_ = (int)auVar141._12_4_;
                auVar141 = vpslld_avx(auVar61,0x17);
                auVar410._8_4_ = 0x3f800000;
                auVar410._0_8_ = 0x3f8000003f800000;
                auVar410._12_4_ = 0x3f800000;
                auVar141 = vpaddd_avx(auVar141,auVar410);
                auVar139 = vfmadd213ps_fma(auVar141,auVar300,auVar439);
                auVar219._8_4_ = 0x800000;
                auVar219._0_8_ = 0x80000000800000;
                auVar219._12_4_ = 0x800000;
                auVar141 = vmaxps_avx(auVar139,auVar219);
                auVar275._8_4_ = 0x807fffff;
                auVar275._0_8_ = 0x807fffff807fffff;
                auVar275._12_4_ = 0x807fffff;
                auVar300 = vpsrld_avx(auVar141,0x17);
                auVar141 = vandps_avx(auVar141,auVar275);
                auVar276._8_4_ = 0x3f000000;
                auVar276._0_8_ = 0x3f0000003f000000;
                auVar276._12_4_ = 0x3f000000;
                auVar50 = vorps_avx(auVar141,auVar276);
                auVar277._8_4_ = 0xffffff82;
                auVar277._0_8_ = 0xffffff82ffffff82;
                auVar277._12_4_ = 0xffffff82;
                auVar199 = vpaddd_avx(auVar300,auVar277);
                auVar307._8_4_ = 0x3f3504f3;
                auVar307._0_8_ = 0x3f3504f33f3504f3;
                auVar307._12_4_ = 0x3f3504f3;
                auVar300 = vcmpps_avx(auVar50,auVar307,1);
                auVar141 = vandps_avx(auVar300,auVar50);
                auVar220._0_4_ = auVar50._0_4_ + -1.0 + auVar141._0_4_;
                auVar220._4_4_ = auVar50._4_4_ + -1.0 + auVar141._4_4_;
                auVar220._8_4_ = auVar50._8_4_ + -1.0 + auVar141._8_4_;
                auVar220._12_4_ = auVar50._12_4_ + -1.0 + auVar141._12_4_;
                auVar141 = vcmpps_avx(auVar139,auVar210,2);
                auVar50 = vcvtdq2ps_avx(auVar199);
                auVar210 = vandps_avx(auVar439,auVar300);
                auVar210 = vsubps_avx(auVar50,auVar210);
                auVar308._8_4_ = 0x3d9021bb;
                auVar308._0_8_ = 0x3d9021bb3d9021bb;
                auVar308._12_4_ = 0x3d9021bb;
                auVar349._8_4_ = 0xbdebd1b8;
                auVar349._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar349._12_4_ = 0xbdebd1b8;
                auVar300 = vfmadd213ps_fma(auVar308,auVar220,auVar349);
                auVar350._8_4_ = 0x3def251a;
                auVar350._0_8_ = 0x3def251a3def251a;
                auVar350._12_4_ = 0x3def251a;
                auVar300 = vfmadd213ps_fma(auVar300,auVar220,auVar350);
                auVar351._8_4_ = 0xbdfe5d4f;
                auVar351._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar351._12_4_ = 0xbdfe5d4f;
                auVar300 = vfmadd213ps_fma(auVar300,auVar220,auVar351);
                auVar352._8_4_ = 0x3e11e9bf;
                auVar352._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar352._12_4_ = 0x3e11e9bf;
                auVar300 = vfmadd213ps_fma(auVar300,auVar220,auVar352);
                auVar353._8_4_ = 0xbe2aae50;
                auVar353._0_8_ = 0xbe2aae50be2aae50;
                auVar353._12_4_ = 0xbe2aae50;
                auVar300 = vfmadd213ps_fma(auVar300,auVar220,auVar353);
                auVar354._8_4_ = 0x3e4cceac;
                auVar354._0_8_ = 0x3e4cceac3e4cceac;
                auVar354._12_4_ = 0x3e4cceac;
                auVar300 = vfmadd213ps_fma(auVar300,auVar220,auVar354);
                auVar355._8_4_ = 0xbe7ffffc;
                auVar355._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar355._12_4_ = 0xbe7ffffc;
                auVar300 = vfmadd213ps_fma(auVar300,auVar220,auVar355);
                auVar356._8_4_ = 0x3eaaaaaa;
                auVar356._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar356._12_4_ = 0x3eaaaaaa;
                auVar300 = vfmadd213ps_fma(auVar300,auVar220,auVar356);
                auVar300 = vfmsub213ps_fma(auVar300,auVar220,auVar433);
                auVar210 = vfmadd213ps_fma(auVar210,auVar427,auVar220);
                auVar221._0_4_ = auVar220._0_4_ * auVar220._0_4_;
                auVar221._4_4_ = auVar220._4_4_ * auVar220._4_4_;
                auVar221._8_4_ = auVar220._8_4_ * auVar220._8_4_;
                auVar221._12_4_ = auVar220._12_4_ * auVar220._12_4_;
                auVar210 = vfmadd231ps_fma(auVar210,auVar221,auVar300);
                auVar222._0_4_ = auVar210._0_4_ * -2.0;
                auVar222._4_4_ = auVar210._4_4_ * -2.0;
                auVar222._8_4_ = auVar210._8_4_ * -2.0;
                auVar222._12_4_ = auVar210._12_4_ * -2.0;
                auVar278._8_4_ = 0x7fffffff;
                auVar278._0_8_ = 0x7fffffff7fffffff;
                auVar278._12_4_ = 0x7fffffff;
                auVar210 = vblendvps_avx(auVar222,auVar278,auVar141);
                auVar62._8_4_ = 0x42b0c0a5;
                auVar62._0_8_ = 0x42b0c0a542b0c0a5;
                auVar62._12_4_ = 0x42b0c0a5;
                auVar210 = vminps_avx(auVar210,auVar62);
                auVar63._8_4_ = 0xc2b0c0a5;
                auVar63._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar63._12_4_ = 0xc2b0c0a5;
                auVar300 = vmaxps_avx(auVar210,auVar63);
                auVar223._8_4_ = 0x3fb8aa3b;
                auVar223._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar223._12_4_ = 0x3fb8aa3b;
                auVar210 = vfmadd213ps_fma(auVar223,auVar300,auVar433);
                auVar279._0_4_ = (int)auVar210._0_4_;
                auVar279._4_4_ = (int)auVar210._4_4_;
                auVar279._8_4_ = (int)auVar210._8_4_;
                auVar279._12_4_ = (int)auVar210._12_4_;
                auVar141 = vcvtdq2ps_avx(auVar279);
                auVar210 = vcmpps_avx(auVar210,auVar141,1);
                auVar210 = vandps_avx(auVar439,auVar210);
                auVar210 = vsubps_avx(auVar141,auVar210);
                auVar300 = vfnmadd231ps_fma(auVar300,auVar210,auVar427);
                fVar49 = auVar300._0_4_;
                auVar280._0_4_ = fVar49 * fVar49;
                fVar48 = auVar300._4_4_;
                auVar280._4_4_ = fVar48 * fVar48;
                fVar11 = auVar300._8_4_;
                auVar280._8_4_ = fVar11 * fVar11;
                fVar265 = auVar300._12_4_;
                auVar280._12_4_ = fVar265 * fVar265;
                auVar141 = vfmadd213ps_fma(auVar445,auVar300,auVar451);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar457);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar463);
                auVar64._8_4_ = 0x3e2aaaaa;
                auVar64._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar64._12_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar64);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar433);
                auVar153._0_4_ = fVar49 + 1.0;
                auVar153._4_4_ = fVar48 + 1.0;
                auVar153._8_4_ = fVar11 + 1.0;
                auVar153._12_4_ = fVar265 + 1.0;
                auVar141 = vfmadd231ps_fma(auVar153,auVar280,auVar141);
                auVar224._0_4_ = (int)auVar210._0_4_;
                auVar224._4_4_ = (int)auVar210._4_4_;
                auVar224._8_4_ = (int)auVar210._8_4_;
                auVar224._12_4_ = (int)auVar210._12_4_;
                auVar210 = vpslld_avx(auVar224,0x17);
                auVar210 = vpaddd_avx(auVar210,auVar410);
                auVar141 = vfmadd213ps_fma(auVar210,auVar141,auVar439);
                auVar210 = vrcpps_avx(auVar141);
                auVar225._0_4_ = auVar210._0_4_ + auVar210._0_4_;
                auVar225._4_4_ = auVar210._4_4_ + auVar210._4_4_;
                auVar225._8_4_ = auVar210._8_4_ + auVar210._8_4_;
                auVar225._12_4_ = auVar210._12_4_ + auVar210._12_4_;
                auVar281._8_4_ = 0x40000000;
                auVar281._0_8_ = 0x4000000040000000;
                auVar281._12_4_ = 0x40000000;
                auVar141 = vfmsub213ps_fma(auVar141,auVar225,auVar281);
                auVar210 = vfnmadd213ps_fma(auVar141,auVar210,auVar225);
                auVar69 = vfmsub213ps_fma(auVar210,local_158._0_16_,local_158._0_16_);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar68._4_4_ = uVar1;
                auVar68._0_4_ = uVar1;
                auVar68._8_4_ = uVar1;
                auVar68._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar159._4_4_ = uVar1;
                auVar159._0_4_ = uVar1;
                auVar159._8_4_ = uVar1;
                auVar159._12_4_ = uVar1;
                auVar141 = vfmadd231ps_fma(auVar159,local_158._0_16_,auVar68);
                auVar210 = vmaxps_avx(auVar141,auVar210);
                auVar160._8_4_ = 0x3f800000;
                auVar160._0_8_ = 0x3f8000003f800000;
                auVar160._12_4_ = 0x3f800000;
                auVar210 = vminps_avx(auVar210,auVar160);
                auVar69._0_4_ = auVar210._0_4_ * local_158._0_4_;
                auVar69._4_4_ = auVar210._4_4_ * local_158._4_4_;
                auVar69._8_4_ = auVar210._8_4_ * local_158._8_4_;
                auVar69._12_4_ = auVar210._12_4_ * local_158._12_4_;
              }
            }
            *pauVar33 = auVar69;
            pauVar33 = pauVar33 + 1;
          }
        }
      }
      if ((iVar2 == 1) && (_elempack == 4)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        uVar35 = 0;
        if (0 < iVar44) {
          uVar35 = uVar29;
        }
        for (uVar34 = 0; uVar34 != uVar35; uVar34 = uVar34 + 1) {
          pauVar33 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar34 * top_blob->elemsize + (long)top_blob->data);
          for (iVar37 = 0; iVar37 <= iVar31; iVar37 = iVar37 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              auVar210 = ZEXT816(0) << 0x40;
            }
            else {
              auVar210 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 +
                                    (long)this->_vptr_Convolution1D_x86_avx2[-3]) + uVar34 * 0x10);
            }
            local_158._0_16_ = auVar210;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar34);
            pauVar32 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            for (uVar39 = 0; uVar39 != uVar45; uVar39 = uVar39 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              puVar40 = (undefined4 *)
                        ((long)bottom_blob_bordered.data +
                        (long)iVar37 * (long)*(int *)(&this->field_0xdc + (long)p_Var4) * 4 +
                        (long)bottom_blob_bordered.w *
                        CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                 (undefined4)bottom_blob_bordered.elemsize) * uVar39);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar42 = 0;
              }
              while (bVar47 = iVar42 != 0, iVar42 = iVar42 + -1, bVar47) {
                uVar1 = *puVar40;
                auVar70._4_4_ = uVar1;
                auVar70._0_4_ = uVar1;
                auVar70._8_4_ = uVar1;
                auVar70._12_4_ = uVar1;
                auVar210 = vfmadd231ps_fma(local_158._0_16_,auVar70,*(undefined1 (*) [16])*pauVar32)
                ;
                local_158._0_16_ = auVar210;
                puVar40 = puVar40 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar79 = local_158._0_16_;
            if (*(int *)(&this->field_0xf4 + (long)p_Var4) - 1U < 6) {
              auVar210 = ZEXT816(0) << 0x40;
              auVar79 = vmaxps_avx(local_158._0_16_,auVar210);
              switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
              case 2:
                auVar210 = vminps_avx(local_158._0_16_,auVar210);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar229._4_4_ = uVar1;
                auVar229._0_4_ = uVar1;
                auVar229._8_4_ = uVar1;
                auVar229._12_4_ = uVar1;
                auVar79 = vfmadd231ps_fma(auVar79,auVar210,auVar229);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar75._4_4_ = uVar1;
                auVar75._0_4_ = uVar1;
                auVar75._8_4_ = uVar1;
                auVar75._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar163._4_4_ = uVar1;
                auVar163._0_4_ = uVar1;
                auVar163._8_4_ = uVar1;
                auVar163._12_4_ = uVar1;
                auVar210 = vmaxps_avx(local_158._0_16_,auVar75);
                auVar79 = vminps_avx(auVar210,auVar163);
                break;
              case 4:
                auVar76._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
                auVar76._8_4_ = -local_158._8_4_;
                auVar76._12_4_ = -local_158._12_4_;
                auVar164._8_4_ = 0x42b0c0a5;
                auVar164._0_8_ = 0x42b0c0a542b0c0a5;
                auVar164._12_4_ = 0x42b0c0a5;
                auVar210 = vminps_avx(auVar76,auVar164);
                auVar165._8_4_ = 0xc2b0c0a5;
                auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar165._12_4_ = 0xc2b0c0a5;
                auVar300 = vmaxps_avx(auVar210,auVar165);
                auVar166._8_4_ = 0x3fb8aa3b;
                auVar166._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar166._12_4_ = 0x3fb8aa3b;
                auVar315._8_4_ = 0x3f000000;
                auVar315._0_8_ = 0x3f0000003f000000;
                auVar315._12_4_ = 0x3f000000;
                auVar210 = vfmadd213ps_fma(auVar166,auVar300,auVar315);
                auVar239._0_4_ = (int)auVar210._0_4_;
                auVar239._4_4_ = (int)auVar210._4_4_;
                auVar239._8_4_ = (int)auVar210._8_4_;
                auVar239._12_4_ = (int)auVar210._12_4_;
                auVar141 = vcvtdq2ps_avx(auVar239);
                auVar210 = vcmpps_avx(auVar210,auVar141,1);
                auVar366._8_4_ = 0x3f800000;
                auVar366._0_8_ = 0x3f8000003f800000;
                auVar366._12_4_ = 0x3f800000;
                auVar210 = vandps_avx(auVar210,auVar366);
                auVar210 = vsubps_avx(auVar141,auVar210);
                auVar240._8_4_ = 0xbf317218;
                auVar240._0_8_ = 0xbf317218bf317218;
                auVar240._12_4_ = 0xbf317218;
                auVar300 = vfmadd231ps_fma(auVar300,auVar210,auVar240);
                fVar49 = auVar300._0_4_;
                auVar241._0_4_ = fVar49 * fVar49;
                fVar48 = auVar300._4_4_;
                auVar241._4_4_ = fVar48 * fVar48;
                fVar11 = auVar300._8_4_;
                auVar241._8_4_ = fVar11 * fVar11;
                fVar265 = auVar300._12_4_;
                auVar241._12_4_ = fVar265 * fVar265;
                auVar290._8_4_ = 0x39506967;
                auVar290._0_8_ = 0x3950696739506967;
                auVar290._12_4_ = 0x39506967;
                auVar383._8_4_ = 0x3ab743ce;
                auVar383._0_8_ = 0x3ab743ce3ab743ce;
                auVar383._12_4_ = 0x3ab743ce;
                auVar141 = vfmadd213ps_fma(auVar290,auVar300,auVar383);
                auVar384._8_4_ = 0x3c088908;
                auVar384._0_8_ = 0x3c0889083c088908;
                auVar384._12_4_ = 0x3c088908;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar384);
                auVar385._8_4_ = 0x3d2aa9c1;
                auVar385._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar385._12_4_ = 0x3d2aa9c1;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar385);
                auVar386._8_4_ = 0x3e2aaaaa;
                auVar386._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar386._12_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar386);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar315);
                auVar316._0_4_ = fVar49 + 1.0;
                auVar316._4_4_ = fVar48 + 1.0;
                auVar316._8_4_ = fVar11 + 1.0;
                auVar316._12_4_ = fVar265 + 1.0;
                auVar141 = vfmadd231ps_fma(auVar316,auVar241,auVar141);
                auVar77._0_4_ = (int)auVar210._0_4_;
                auVar77._4_4_ = (int)auVar210._4_4_;
                auVar77._8_4_ = (int)auVar210._8_4_;
                auVar77._12_4_ = (int)auVar210._12_4_;
                auVar210 = vpslld_avx(auVar77,0x17);
                auVar167._8_4_ = 0x3f800000;
                auVar167._0_8_ = 0x3f8000003f800000;
                auVar167._12_4_ = 0x3f800000;
                auVar210 = vpaddd_avx(auVar210,auVar167);
                auVar141 = vfmadd213ps_fma(auVar210,auVar141,auVar366);
                auVar210 = vrcpps_avx(auVar141);
                auVar141 = vfmsub213ps_fma(auVar141,auVar210,auVar366);
                auVar79 = vfnmadd132ps_fma(auVar141,auVar210,auVar210);
                break;
              case 5:
                auVar411._8_4_ = 0x42b0c0a5;
                auVar411._0_8_ = 0x42b0c0a542b0c0a5;
                auVar411._12_4_ = 0x42b0c0a5;
                auVar141 = vminps_avx(local_158._0_16_,auVar411);
                auVar422._8_4_ = 0xc2b0c0a5;
                auVar422._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar422._12_4_ = 0xc2b0c0a5;
                auVar50 = vmaxps_avx(auVar422,auVar141);
                auVar161._8_4_ = 0x3fb8aa3b;
                auVar161._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar161._12_4_ = 0x3fb8aa3b;
                auVar434._8_4_ = 0x3f000000;
                auVar434._0_8_ = 0x3f0000003f000000;
                auVar434._12_4_ = 0x3f000000;
                auVar141 = vfmadd213ps_fma(auVar161,auVar50,auVar434);
                auVar230._0_4_ = (int)auVar141._0_4_;
                auVar230._4_4_ = (int)auVar141._4_4_;
                auVar230._8_4_ = (int)auVar141._8_4_;
                auVar230._12_4_ = (int)auVar141._12_4_;
                auVar300 = vcvtdq2ps_avx(auVar230);
                auVar141 = vcmpps_avx(auVar141,auVar300,1);
                auVar440._8_4_ = 0x3f800000;
                auVar440._0_8_ = 0x3f8000003f800000;
                auVar440._12_4_ = 0x3f800000;
                auVar141 = vandps_avx(auVar440,auVar141);
                auVar141 = vsubps_avx(auVar300,auVar141);
                auVar428._8_4_ = 0x3f317218;
                auVar428._0_8_ = 0x3f3172183f317218;
                auVar428._12_4_ = 0x3f317218;
                auVar50 = vfnmadd231ps_fma(auVar50,auVar141,auVar428);
                fVar49 = auVar50._0_4_;
                auVar231._0_4_ = fVar49 * fVar49;
                fVar48 = auVar50._4_4_;
                auVar231._4_4_ = fVar48 * fVar48;
                fVar11 = auVar50._8_4_;
                auVar231._8_4_ = fVar11 * fVar11;
                fVar265 = auVar50._12_4_;
                auVar231._12_4_ = fVar265 * fVar265;
                auVar446._8_4_ = 0x39506967;
                auVar446._0_8_ = 0x3950696739506967;
                auVar446._12_4_ = 0x39506967;
                auVar452._8_4_ = 0x3ab743ce;
                auVar452._0_8_ = 0x3ab743ce3ab743ce;
                auVar452._12_4_ = 0x3ab743ce;
                auVar300 = vfmadd213ps_fma(auVar446,auVar50,auVar452);
                auVar458._8_4_ = 0x3c088908;
                auVar458._0_8_ = 0x3c0889083c088908;
                auVar458._12_4_ = 0x3c088908;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar458);
                auVar464._8_4_ = 0x3d2aa9c1;
                auVar464._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar464._12_4_ = 0x3d2aa9c1;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar464);
                auVar311._8_4_ = 0x3e2aaaaa;
                auVar311._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar311._12_4_ = 0x3e2aaaaa;
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar311);
                auVar300 = vfmadd213ps_fma(auVar300,auVar50,auVar434);
                auVar312._0_4_ = fVar49 + 1.0;
                auVar312._4_4_ = fVar48 + 1.0;
                auVar312._8_4_ = fVar11 + 1.0;
                auVar312._12_4_ = fVar265 + 1.0;
                auVar300 = vfmadd231ps_fma(auVar312,auVar231,auVar300);
                auVar71._0_4_ = (int)auVar141._0_4_;
                auVar71._4_4_ = (int)auVar141._4_4_;
                auVar71._8_4_ = (int)auVar141._8_4_;
                auVar71._12_4_ = (int)auVar141._12_4_;
                auVar141 = vpslld_avx(auVar71,0x17);
                auVar412._8_4_ = 0x3f800000;
                auVar412._0_8_ = 0x3f8000003f800000;
                auVar412._12_4_ = 0x3f800000;
                auVar141 = vpaddd_avx(auVar141,auVar412);
                auVar139 = vfmadd213ps_fma(auVar141,auVar300,auVar440);
                auVar232._8_4_ = 0x800000;
                auVar232._0_8_ = 0x80000000800000;
                auVar232._12_4_ = 0x800000;
                auVar141 = vmaxps_avx(auVar139,auVar232);
                auVar283._8_4_ = 0x807fffff;
                auVar283._0_8_ = 0x807fffff807fffff;
                auVar283._12_4_ = 0x807fffff;
                auVar300 = vpsrld_avx(auVar141,0x17);
                auVar141 = vandps_avx(auVar141,auVar283);
                auVar284._8_4_ = 0x3f000000;
                auVar284._0_8_ = 0x3f0000003f000000;
                auVar284._12_4_ = 0x3f000000;
                auVar50 = vorps_avx(auVar141,auVar284);
                auVar285._8_4_ = 0xffffff82;
                auVar285._0_8_ = 0xffffff82ffffff82;
                auVar285._12_4_ = 0xffffff82;
                auVar199 = vpaddd_avx(auVar300,auVar285);
                auVar313._8_4_ = 0x3f3504f3;
                auVar313._0_8_ = 0x3f3504f33f3504f3;
                auVar313._12_4_ = 0x3f3504f3;
                auVar300 = vcmpps_avx(auVar50,auVar313,1);
                auVar141 = vandps_avx(auVar300,auVar50);
                auVar233._0_4_ = auVar50._0_4_ + -1.0 + auVar141._0_4_;
                auVar233._4_4_ = auVar50._4_4_ + -1.0 + auVar141._4_4_;
                auVar233._8_4_ = auVar50._8_4_ + -1.0 + auVar141._8_4_;
                auVar233._12_4_ = auVar50._12_4_ + -1.0 + auVar141._12_4_;
                auVar141 = vcmpps_avx(auVar139,auVar210,2);
                auVar50 = vcvtdq2ps_avx(auVar199);
                auVar210 = vandps_avx(auVar440,auVar300);
                auVar210 = vsubps_avx(auVar50,auVar210);
                auVar314._8_4_ = 0x3d9021bb;
                auVar314._0_8_ = 0x3d9021bb3d9021bb;
                auVar314._12_4_ = 0x3d9021bb;
                auVar358._8_4_ = 0xbdebd1b8;
                auVar358._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar358._12_4_ = 0xbdebd1b8;
                auVar300 = vfmadd213ps_fma(auVar314,auVar233,auVar358);
                auVar359._8_4_ = 0x3def251a;
                auVar359._0_8_ = 0x3def251a3def251a;
                auVar359._12_4_ = 0x3def251a;
                auVar300 = vfmadd213ps_fma(auVar300,auVar233,auVar359);
                auVar360._8_4_ = 0xbdfe5d4f;
                auVar360._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar360._12_4_ = 0xbdfe5d4f;
                auVar300 = vfmadd213ps_fma(auVar300,auVar233,auVar360);
                auVar361._8_4_ = 0x3e11e9bf;
                auVar361._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar361._12_4_ = 0x3e11e9bf;
                auVar300 = vfmadd213ps_fma(auVar300,auVar233,auVar361);
                auVar362._8_4_ = 0xbe2aae50;
                auVar362._0_8_ = 0xbe2aae50be2aae50;
                auVar362._12_4_ = 0xbe2aae50;
                auVar300 = vfmadd213ps_fma(auVar300,auVar233,auVar362);
                auVar363._8_4_ = 0x3e4cceac;
                auVar363._0_8_ = 0x3e4cceac3e4cceac;
                auVar363._12_4_ = 0x3e4cceac;
                auVar300 = vfmadd213ps_fma(auVar300,auVar233,auVar363);
                auVar364._8_4_ = 0xbe7ffffc;
                auVar364._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar364._12_4_ = 0xbe7ffffc;
                auVar300 = vfmadd213ps_fma(auVar300,auVar233,auVar364);
                auVar365._8_4_ = 0x3eaaaaaa;
                auVar365._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar365._12_4_ = 0x3eaaaaaa;
                auVar300 = vfmadd213ps_fma(auVar300,auVar233,auVar365);
                auVar300 = vfmsub213ps_fma(auVar300,auVar233,auVar434);
                auVar210 = vfmadd213ps_fma(auVar210,auVar428,auVar233);
                auVar234._0_4_ = auVar233._0_4_ * auVar233._0_4_;
                auVar234._4_4_ = auVar233._4_4_ * auVar233._4_4_;
                auVar234._8_4_ = auVar233._8_4_ * auVar233._8_4_;
                auVar234._12_4_ = auVar233._12_4_ * auVar233._12_4_;
                auVar210 = vfmadd231ps_fma(auVar210,auVar234,auVar300);
                auVar235._0_4_ = auVar210._0_4_ * -2.0;
                auVar235._4_4_ = auVar210._4_4_ * -2.0;
                auVar235._8_4_ = auVar210._8_4_ * -2.0;
                auVar235._12_4_ = auVar210._12_4_ * -2.0;
                auVar286._8_4_ = 0x7fffffff;
                auVar286._0_8_ = 0x7fffffff7fffffff;
                auVar286._12_4_ = 0x7fffffff;
                auVar210 = vblendvps_avx(auVar235,auVar286,auVar141);
                auVar72._8_4_ = 0x42b0c0a5;
                auVar72._0_8_ = 0x42b0c0a542b0c0a5;
                auVar72._12_4_ = 0x42b0c0a5;
                auVar210 = vminps_avx(auVar210,auVar72);
                auVar73._8_4_ = 0xc2b0c0a5;
                auVar73._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar73._12_4_ = 0xc2b0c0a5;
                auVar300 = vmaxps_avx(auVar210,auVar73);
                auVar236._8_4_ = 0x3fb8aa3b;
                auVar236._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar236._12_4_ = 0x3fb8aa3b;
                auVar210 = vfmadd213ps_fma(auVar236,auVar300,auVar434);
                auVar287._0_4_ = (int)auVar210._0_4_;
                auVar287._4_4_ = (int)auVar210._4_4_;
                auVar287._8_4_ = (int)auVar210._8_4_;
                auVar287._12_4_ = (int)auVar210._12_4_;
                auVar141 = vcvtdq2ps_avx(auVar287);
                auVar210 = vcmpps_avx(auVar210,auVar141,1);
                auVar210 = vandps_avx(auVar440,auVar210);
                auVar210 = vsubps_avx(auVar141,auVar210);
                auVar300 = vfnmadd231ps_fma(auVar300,auVar210,auVar428);
                fVar49 = auVar300._0_4_;
                auVar288._0_4_ = fVar49 * fVar49;
                fVar48 = auVar300._4_4_;
                auVar288._4_4_ = fVar48 * fVar48;
                fVar11 = auVar300._8_4_;
                auVar288._8_4_ = fVar11 * fVar11;
                fVar265 = auVar300._12_4_;
                auVar288._12_4_ = fVar265 * fVar265;
                auVar141 = vfmadd213ps_fma(auVar446,auVar300,auVar452);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar458);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar464);
                auVar74._8_4_ = 0x3e2aaaaa;
                auVar74._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar74._12_4_ = 0x3e2aaaaa;
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar74);
                auVar141 = vfmadd213ps_fma(auVar141,auVar300,auVar434);
                auVar162._0_4_ = fVar49 + 1.0;
                auVar162._4_4_ = fVar48 + 1.0;
                auVar162._8_4_ = fVar11 + 1.0;
                auVar162._12_4_ = fVar265 + 1.0;
                auVar141 = vfmadd231ps_fma(auVar162,auVar288,auVar141);
                auVar237._0_4_ = (int)auVar210._0_4_;
                auVar237._4_4_ = (int)auVar210._4_4_;
                auVar237._8_4_ = (int)auVar210._8_4_;
                auVar237._12_4_ = (int)auVar210._12_4_;
                auVar210 = vpslld_avx(auVar237,0x17);
                auVar210 = vpaddd_avx(auVar210,auVar412);
                auVar141 = vfmadd213ps_fma(auVar210,auVar141,auVar440);
                auVar210 = vrcpps_avx(auVar141);
                auVar238._0_4_ = auVar210._0_4_ + auVar210._0_4_;
                auVar238._4_4_ = auVar210._4_4_ + auVar210._4_4_;
                auVar238._8_4_ = auVar210._8_4_ + auVar210._8_4_;
                auVar238._12_4_ = auVar210._12_4_ + auVar210._12_4_;
                auVar289._8_4_ = 0x40000000;
                auVar289._0_8_ = 0x4000000040000000;
                auVar289._12_4_ = 0x40000000;
                auVar141 = vfmsub213ps_fma(auVar141,auVar238,auVar289);
                auVar210 = vfnmadd213ps_fma(auVar141,auVar210,auVar238);
                auVar79 = vfmsub213ps_fma(auVar210,local_158._0_16_,local_158._0_16_);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar78._4_4_ = uVar1;
                auVar78._0_4_ = uVar1;
                auVar78._8_4_ = uVar1;
                auVar78._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar168._4_4_ = uVar1;
                auVar168._0_4_ = uVar1;
                auVar168._8_4_ = uVar1;
                auVar168._12_4_ = uVar1;
                auVar141 = vfmadd231ps_fma(auVar168,local_158._0_16_,auVar78);
                auVar210 = vmaxps_avx(auVar141,auVar210);
                auVar169._8_4_ = 0x3f800000;
                auVar169._0_8_ = 0x3f8000003f800000;
                auVar169._12_4_ = 0x3f800000;
                auVar210 = vminps_avx(auVar210,auVar169);
                auVar79._0_4_ = auVar210._0_4_ * local_158._0_4_;
                auVar79._4_4_ = auVar210._4_4_ * local_158._4_4_;
                auVar79._8_4_ = auVar210._8_4_ * local_158._8_4_;
                auVar79._12_4_ = auVar210._12_4_ * local_158._12_4_;
              }
            }
            *pauVar33 = auVar79;
            pauVar33 = pauVar33 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 1)) {
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        uVar35 = 0;
        if (0 < iVar44) {
          uVar35 = uVar29;
        }
        for (uVar34 = 0; uVar34 != uVar35; uVar34 = uVar34 + 1) {
          iVar31 = top_blob->w;
          sVar5 = top_blob->elemsize;
          pvVar6 = top_blob->data;
          for (lVar46 = 0; lVar46 <= lVar30; lVar46 = lVar46 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx2[-3]) == 0) {
              auVar210 = ZEXT816(0) << 0x40;
            }
            else {
              auVar210 = ZEXT416(*(uint *)(*(long *)(&this->field_0x190 +
                                                    (long)this->_vptr_Convolution1D_x86_avx2[-3]) +
                                          uVar34 * 4));
            }
            local_158._0_16_ = auVar210;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar34);
            pauVar32 = (undefined1 (*) [32])local_80.data;
            Mat::~Mat(&local_80);
            for (uVar39 = 0; uVar39 != uVar45; uVar39 = uVar39 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
              pfVar41 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)lVar46 * 4
                                       ) * 4 +
                                 (long)bottom_blob_bordered.w *
                                 CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                          (undefined4)bottom_blob_bordered.elemsize) * uVar39);
              iVar37 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar37 = 0;
              }
              while (bVar47 = iVar37 != 0, iVar37 = iVar37 + -1, bVar47) {
                auVar80._0_4_ = *(float *)*pauVar32 * *pfVar41;
                auVar80._4_4_ = *(float *)(*pauVar32 + 4) * pfVar41[1];
                auVar80._8_4_ = *(float *)(*pauVar32 + 8) * pfVar41[2];
                auVar80._12_4_ = *(float *)(*pauVar32 + 0xc) * pfVar41[3];
                auVar210 = vshufpd_avx(auVar80,auVar80,1);
                auVar81._0_4_ = auVar210._0_4_ + auVar80._0_4_;
                auVar81._4_4_ = auVar210._4_4_ + auVar80._4_4_;
                auVar81._8_4_ = auVar210._8_4_ + auVar80._8_4_;
                auVar81._12_4_ = auVar210._12_4_ + auVar80._12_4_;
                auVar210 = vmovshdup_avx(auVar81);
                local_158._0_16_ =
                     ZEXT416((uint)(auVar210._0_4_ + auVar81._0_4_ + (float)local_158._0_4_));
                pfVar41 = pfVar41 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 4;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
            auVar210 = local_158._0_16_;
            fVar49 = (float)local_158._0_4_;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar210 = vmaxss_avx(auVar210,ZEXT416(0));
              fVar49 = auVar210._0_4_;
              break;
            case 2:
              auVar210 = vcmpss_avx(ZEXT816(0) << 0x40,auVar210,1);
              auVar242._8_4_ = 0x3f800000;
              auVar242._0_8_ = 0x3f8000003f800000;
              auVar242._12_4_ = 0x3f800000;
              auVar210 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar242,auVar210);
              fVar49 = auVar210._0_4_ * (float)local_158._0_4_;
              break;
            case 3:
              auVar210 = vmaxss_avx(auVar210,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              auVar210 = vminss_avx(auVar210,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4))
                                                     [1]));
              fVar49 = auVar210._0_4_;
              break;
            case 4:
              fVar49 = expf(-(float)local_158._0_4_);
              fVar49 = 1.0 / (fVar49 + 1.0);
              break;
            case 5:
              fVar49 = expf((float)local_158._0_4_);
              fVar49 = logf(fVar49 + 1.0);
              fVar49 = tanhf(fVar49);
              fVar49 = fVar49 * (float)local_158._0_4_;
              break;
            case 6:
              fVar48 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar11 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar265 = -fVar11 / fVar48;
              fVar49 = 0.0;
              if ((fVar265 <= (float)local_158._0_4_) &&
                 (fVar49 = (float)local_158._0_4_, (float)local_158._0_4_ <= fVar265 + 1.0 / fVar48)
                 ) {
                auVar210 = vfmadd213ss_fma(ZEXT416((uint)fVar48),auVar210,ZEXT416((uint)fVar11));
                fVar49 = auVar210._0_4_ * (float)local_158._0_4_;
              }
            }
            *(float *)((long)pvVar6 + lVar46 * 4 + (long)iVar31 * uVar34 * sVar5) = fVar49;
          }
        }
      }
      local_118 = 0;
      if ((iVar2 == 1) && (_elempack == 1)) {
        iVar2 = top_blob->w;
        sVar5 = top_blob->elemsize;
        uVar45 = 0;
        if (0 < iVar28) {
          uVar45 = (ulong)(uint)iVar28;
        }
        local_118 = 0;
        if (iVar44 < 1) {
          uVar29 = 0;
        }
        pvVar6 = top_blob->data;
        for (uVar35 = 0; uVar35 != uVar29; uVar35 = uVar35 + 1) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx2;
          for (lVar46 = 0; lVar46 <= lVar30; lVar46 = lVar46 + 1) {
            p_Var4 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar138 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) + uVar35 * 4
                                          ));
            }
            iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var4);
            puVar36 = (uint *)((long)(iVar28 * (int)uVar35 * iVar31) * 4 +
                              *(long *)(&this->field_0x148 + (long)p_Var4));
            if (iVar31 < 1) {
              iVar31 = 0;
            }
            for (uVar34 = 0; uVar34 != uVar45; uVar34 = uVar34 + 1) {
              puVar43 = (uint *)((long)bottom_blob_bordered.data +
                                (long)*(int *)(&this->field_0xdc + (long)p_Var4) * (long)(int)lVar46
                                * 4 + (long)bottom_blob_bordered.w *
                                      CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                               (undefined4)bottom_blob_bordered.elemsize) * uVar34);
              iVar44 = iVar31;
              while (bVar47 = iVar44 != 0, iVar44 = iVar44 + -1, bVar47) {
                auVar210 = vfmadd231ss_fma(auVar138._0_16_,ZEXT416(*puVar36),ZEXT416(*puVar43));
                auVar138 = ZEXT1664(auVar210);
                puVar43 = puVar43 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                puVar36 = puVar36 + 1;
              }
            }
            auVar210 = auVar138._0_16_;
            fVar48 = auVar138._0_4_;
            fVar49 = fVar48;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar210 = vmaxss_avx(auVar210,ZEXT416(0));
              fVar49 = auVar210._0_4_;
              break;
            case 2:
              auVar210 = vcmpss_avx(ZEXT816(0) << 0x40,auVar210,1);
              auVar243._8_4_ = 0x3f800000;
              auVar243._0_8_ = 0x3f8000003f800000;
              auVar243._12_4_ = 0x3f800000;
              auVar210 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar243,auVar210);
              fVar49 = auVar210._0_4_ * fVar48;
              break;
            case 3:
              auVar210 = vmaxss_avx(auVar210,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              auVar210 = vminss_avx(auVar210,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4))
                                                     [1]));
              fVar49 = auVar210._0_4_;
              break;
            case 4:
              fVar49 = expf(-fVar48);
              fVar49 = 1.0 / (fVar49 + 1.0);
              break;
            case 5:
              fVar49 = expf(fVar48);
              fVar49 = logf(fVar49 + 1.0);
              fVar49 = tanhf(fVar49);
              fVar49 = fVar49 * fVar48;
              break;
            case 6:
              fVar11 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar265 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar264 = -fVar265 / fVar11;
              fVar49 = 0.0;
              if ((fVar264 <= fVar48) && (fVar49 = fVar48, fVar48 <= fVar264 + 1.0 / fVar11)) {
                auVar210 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar210,ZEXT416((uint)fVar265));
                fVar49 = auVar210._0_4_ * fVar48;
              }
            }
            *(float *)((long)pvVar6 + lVar46 * 4 + (long)iVar2 * sVar5 * uVar35) = fVar49;
          }
        }
      }
    }
  }
  Mat::~Mat(&bottom_blob_bordered);
  return local_118;
}

Assistant:

int Convolution1D_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}